

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_16,_16777232,_false,_embree::avx512::SubdivPatch1MBIntersectorK<16>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  RayK<16> *pRVar1;
  BVH *bvh;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [32];
  ulong uVar22;
  ulong uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  size_t k;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  long lVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  AABBNodeMB4D *node1;
  ulong uVar50;
  long lVar51;
  ushort uVar52;
  uint uVar53;
  ulong uVar54;
  long lVar55;
  ulong *puVar56;
  long lVar57;
  GridSOA *pGVar58;
  long lVar59;
  long lVar60;
  GridSOA *pGVar61;
  uint uVar62;
  long lVar63;
  ulong uVar64;
  undefined4 uVar65;
  long lVar66;
  Primitive_conflict3 *prim;
  NodeRef root;
  ulong uVar67;
  undefined1 (*pauVar68) [64];
  bool bVar69;
  ulong uVar70;
  ulong uVar71;
  int iVar72;
  undefined1 auVar73 [16];
  int iVar119;
  int iVar120;
  int iVar122;
  int iVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  int iVar121;
  int iVar133;
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar134 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM30 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  vint<16> vitime;
  TravRayK<16,_false> tray;
  NodeRef stack_node [241];
  vfloat<16> stack_near [241];
  uint local_5370;
  GridSOA *local_5368;
  uint local_5354;
  GridSOA *local_5320;
  GridSOA *local_5318;
  GridSOA *local_5308;
  Precalculations local_52f0;
  undefined1 (*local_52e0) [32];
  long local_52d8;
  GridSOA *local_52d0;
  GridSOA *local_52c8;
  GridSOA *local_52c0;
  GridSOA *local_52b8;
  GridSOA *local_52b0;
  GridSOA *local_52a8;
  GridSOA *local_52a0;
  GridSOA *local_5298;
  RTCFilterFunctionNArguments local_5290;
  long local_5260;
  GridSOA *local_5258;
  long local_5250;
  GridSOA *local_5248;
  undefined1 local_5240 [64];
  undefined1 local_5200 [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  undefined1 local_5140 [64];
  undefined1 local_5100 [64];
  undefined1 local_50c0 [64];
  undefined1 local_5080 [64];
  undefined1 local_5040 [64];
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 uStack_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 uStack_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 uStack_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined1 local_4f40 [64];
  undefined1 local_4f00 [64];
  undefined1 local_4ec0 [64];
  undefined1 local_4e80 [64];
  undefined1 local_4e40 [64];
  undefined1 local_4e00 [64];
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 uStack_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined1 local_4d80 [64];
  undefined1 local_4d40 [64];
  undefined1 local_4d00 [64];
  undefined1 local_4cc0 [64];
  undefined1 local_4c80 [64];
  undefined1 local_4c40 [64];
  undefined1 local_4c00 [64];
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [64];
  undefined1 local_4b40 [64];
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_48c0;
  undefined1 local_4800 [64];
  undefined1 local_47c0 [64];
  undefined1 local_4780 [64];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  uint local_4500;
  uint uStack_44fc;
  uint uStack_44f8;
  uint uStack_44f4;
  uint uStack_44f0;
  uint uStack_44ec;
  uint uStack_44e8;
  uint uStack_44e4;
  uint uStack_44e0;
  uint uStack_44dc;
  uint uStack_44d8;
  uint uStack_44d4;
  uint uStack_44d0;
  uint uStack_44cc;
  uint uStack_44c8;
  uint uStack_44c4;
  uint local_44c0;
  uint uStack_44bc;
  uint uStack_44b8;
  uint uStack_44b4;
  uint uStack_44b0;
  uint uStack_44ac;
  uint uStack_44a8;
  uint uStack_44a4;
  uint uStack_44a0;
  uint uStack_449c;
  uint uStack_4498;
  uint uStack_4494;
  uint uStack_4490;
  uint uStack_448c;
  uint uStack_4488;
  uint uStack_4484;
  undefined8 local_4450;
  size_t local_4448;
  ulong local_4440 [240];
  undefined1 local_3cc0 [64];
  uint local_3c80;
  uint uStack_3c7c;
  uint uStack_3c78;
  uint uStack_3c74;
  uint uStack_3c70;
  uint uStack_3c6c;
  uint uStack_3c68;
  uint uStack_3c64;
  uint uStack_3c60;
  uint uStack_3c5c;
  uint uStack_3c58;
  uint uStack_3c54;
  uint uStack_3c50;
  uint uStack_3c4c;
  uint uStack_3c48;
  uint uStack_3c44;
  undefined1 local_3c40 [15376];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar74 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    auVar134 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar70 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar134,5);
    uVar67 = vpcmpeqd_avx512f(auVar74,(undefined1  [64])valid_i->field_0);
    uVar70 = uVar70 & uVar67;
    if ((ushort)uVar70 != 0) {
      local_52f0.super_Precalculations.grid = (GridSOA *)0x0;
      local_48c0.field_0.x.field_0 =
           (vfloat_impl<16>)(vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray;
      local_48c0.field_0.y.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40);
      local_48c0.field_0.z.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80);
      local_4800 = *(undefined1 (*) [64])(ray + 0x100);
      local_47c0 = *(undefined1 (*) [64])(ray + 0x140);
      local_4780 = *(undefined1 (*) [64])(ray + 0x180);
      auVar75 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar74 = vandps_avx512dq(local_4800,auVar75);
      auVar76 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar67 = vcmpps_avx512f(auVar74,auVar76,1);
      bVar69 = (bool)((byte)uVar67 & 1);
      iVar72 = auVar76._0_4_;
      auVar74._0_4_ = (uint)bVar69 * iVar72 | (uint)!bVar69 * local_4800._0_4_;
      bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
      iVar119 = auVar76._4_4_;
      auVar74._4_4_ = (uint)bVar69 * iVar119 | (uint)!bVar69 * local_4800._4_4_;
      bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
      iVar120 = auVar76._8_4_;
      auVar74._8_4_ = (uint)bVar69 * iVar120 | (uint)!bVar69 * local_4800._8_4_;
      bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
      iVar121 = auVar76._12_4_;
      auVar74._12_4_ = (uint)bVar69 * iVar121 | (uint)!bVar69 * local_4800._12_4_;
      bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
      iVar122 = auVar76._16_4_;
      auVar74._16_4_ = (uint)bVar69 * iVar122 | (uint)!bVar69 * local_4800._16_4_;
      bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
      iVar123 = auVar76._20_4_;
      auVar74._20_4_ = (uint)bVar69 * iVar123 | (uint)!bVar69 * local_4800._20_4_;
      bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
      iVar124 = auVar76._24_4_;
      auVar74._24_4_ = (uint)bVar69 * iVar124 | (uint)!bVar69 * local_4800._24_4_;
      bVar69 = (bool)((byte)(uVar67 >> 7) & 1);
      iVar125 = auVar76._28_4_;
      auVar74._28_4_ = (uint)bVar69 * iVar125 | (uint)!bVar69 * local_4800._28_4_;
      bVar69 = (bool)((byte)(uVar67 >> 8) & 1);
      iVar126 = auVar76._32_4_;
      auVar74._32_4_ = (uint)bVar69 * iVar126 | (uint)!bVar69 * local_4800._32_4_;
      bVar69 = (bool)((byte)(uVar67 >> 9) & 1);
      iVar127 = auVar76._36_4_;
      auVar74._36_4_ = (uint)bVar69 * iVar127 | (uint)!bVar69 * local_4800._36_4_;
      bVar69 = (bool)((byte)(uVar67 >> 10) & 1);
      iVar128 = auVar76._40_4_;
      auVar74._40_4_ = (uint)bVar69 * iVar128 | (uint)!bVar69 * local_4800._40_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xb) & 1);
      iVar129 = auVar76._44_4_;
      auVar74._44_4_ = (uint)bVar69 * iVar129 | (uint)!bVar69 * local_4800._44_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xc) & 1);
      iVar130 = auVar76._48_4_;
      auVar74._48_4_ = (uint)bVar69 * iVar130 | (uint)!bVar69 * local_4800._48_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xd) & 1);
      iVar131 = auVar76._52_4_;
      auVar74._52_4_ = (uint)bVar69 * iVar131 | (uint)!bVar69 * local_4800._52_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xe) & 1);
      iVar132 = auVar76._56_4_;
      iVar133 = auVar76._60_4_;
      auVar74._56_4_ = (uint)bVar69 * iVar132 | (uint)!bVar69 * local_4800._56_4_;
      bVar69 = SUB81(uVar67 >> 0xf,0);
      auVar74._60_4_ = (uint)bVar69 * iVar133 | (uint)!bVar69 * local_4800._60_4_;
      auVar77 = vandps_avx512dq(local_47c0,auVar75);
      uVar67 = vcmpps_avx512f(auVar77,auVar76,1);
      bVar69 = (bool)((byte)uVar67 & 1);
      auVar77._0_4_ = (uint)bVar69 * iVar72 | (uint)!bVar69 * local_47c0._0_4_;
      bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar77._4_4_ = (uint)bVar69 * iVar119 | (uint)!bVar69 * local_47c0._4_4_;
      bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar77._8_4_ = (uint)bVar69 * iVar120 | (uint)!bVar69 * local_47c0._8_4_;
      bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar77._12_4_ = (uint)bVar69 * iVar121 | (uint)!bVar69 * local_47c0._12_4_;
      bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar77._16_4_ = (uint)bVar69 * iVar122 | (uint)!bVar69 * local_47c0._16_4_;
      bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar77._20_4_ = (uint)bVar69 * iVar123 | (uint)!bVar69 * local_47c0._20_4_;
      bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar77._24_4_ = (uint)bVar69 * iVar124 | (uint)!bVar69 * local_47c0._24_4_;
      bVar69 = (bool)((byte)(uVar67 >> 7) & 1);
      auVar77._28_4_ = (uint)bVar69 * iVar125 | (uint)!bVar69 * local_47c0._28_4_;
      bVar69 = (bool)((byte)(uVar67 >> 8) & 1);
      auVar77._32_4_ = (uint)bVar69 * iVar126 | (uint)!bVar69 * local_47c0._32_4_;
      bVar69 = (bool)((byte)(uVar67 >> 9) & 1);
      auVar77._36_4_ = (uint)bVar69 * iVar127 | (uint)!bVar69 * local_47c0._36_4_;
      bVar69 = (bool)((byte)(uVar67 >> 10) & 1);
      auVar77._40_4_ = (uint)bVar69 * iVar128 | (uint)!bVar69 * local_47c0._40_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xb) & 1);
      auVar77._44_4_ = (uint)bVar69 * iVar129 | (uint)!bVar69 * local_47c0._44_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xc) & 1);
      auVar77._48_4_ = (uint)bVar69 * iVar130 | (uint)!bVar69 * local_47c0._48_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xd) & 1);
      auVar77._52_4_ = (uint)bVar69 * iVar131 | (uint)!bVar69 * local_47c0._52_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xe) & 1);
      auVar77._56_4_ = (uint)bVar69 * iVar132 | (uint)!bVar69 * local_47c0._56_4_;
      bVar69 = SUB81(uVar67 >> 0xf,0);
      auVar77._60_4_ = (uint)bVar69 * iVar133 | (uint)!bVar69 * local_47c0._60_4_;
      auVar78 = vandps_avx512dq(local_4780,auVar75);
      uVar67 = vcmpps_avx512f(auVar78,auVar76,1);
      auVar76 = vrcp14ps_avx512f(auVar74);
      bVar69 = (bool)((byte)uVar67 & 1);
      auVar78._0_4_ = (uint)bVar69 * iVar72 | (uint)!bVar69 * local_4780._0_4_;
      bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar78._4_4_ = (uint)bVar69 * iVar119 | (uint)!bVar69 * local_4780._4_4_;
      bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar78._8_4_ = (uint)bVar69 * iVar120 | (uint)!bVar69 * local_4780._8_4_;
      bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar78._12_4_ = (uint)bVar69 * iVar121 | (uint)!bVar69 * local_4780._12_4_;
      bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar78._16_4_ = (uint)bVar69 * iVar122 | (uint)!bVar69 * local_4780._16_4_;
      bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar78._20_4_ = (uint)bVar69 * iVar123 | (uint)!bVar69 * local_4780._20_4_;
      bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar78._24_4_ = (uint)bVar69 * iVar124 | (uint)!bVar69 * local_4780._24_4_;
      bVar69 = (bool)((byte)(uVar67 >> 7) & 1);
      auVar78._28_4_ = (uint)bVar69 * iVar125 | (uint)!bVar69 * local_4780._28_4_;
      bVar69 = (bool)((byte)(uVar67 >> 8) & 1);
      auVar78._32_4_ = (uint)bVar69 * iVar126 | (uint)!bVar69 * local_4780._32_4_;
      bVar69 = (bool)((byte)(uVar67 >> 9) & 1);
      auVar78._36_4_ = (uint)bVar69 * iVar127 | (uint)!bVar69 * local_4780._36_4_;
      bVar69 = (bool)((byte)(uVar67 >> 10) & 1);
      auVar78._40_4_ = (uint)bVar69 * iVar128 | (uint)!bVar69 * local_4780._40_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xb) & 1);
      auVar78._44_4_ = (uint)bVar69 * iVar129 | (uint)!bVar69 * local_4780._44_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xc) & 1);
      auVar78._48_4_ = (uint)bVar69 * iVar130 | (uint)!bVar69 * local_4780._48_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xd) & 1);
      auVar78._52_4_ = (uint)bVar69 * iVar131 | (uint)!bVar69 * local_4780._52_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xe) & 1);
      auVar78._56_4_ = (uint)bVar69 * iVar132 | (uint)!bVar69 * local_4780._56_4_;
      bVar69 = SUB81(uVar67 >> 0xf,0);
      auVar78._60_4_ = (uint)bVar69 * iVar133 | (uint)!bVar69 * local_4780._60_4_;
      auVar79 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar80 = vrcp14ps_avx512f(auVar77);
      auVar74 = vfnmadd213ps_avx512f(auVar74,auVar76,auVar79);
      local_4740 = vfmadd132ps_avx512f(auVar74,auVar76,auVar76);
      auVar74 = vfnmadd213ps_avx512f(auVar77,auVar80,auVar79);
      auVar76 = vrcp14ps_avx512f(auVar78);
      local_4700 = vfmadd132ps_avx512f(auVar74,auVar80,auVar80);
      auVar74 = vfnmadd213ps_avx512f(auVar78,auVar76,auVar79);
      local_46c0 = vfmadd132ps_avx512f(auVar74,auVar76,auVar76);
      local_4680 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray,local_4740)
      ;
      local_4640 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40),
                                  local_4700);
      local_4600 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80),
                                  local_46c0);
      uVar67 = vcmpps_avx512f(local_4740,auVar134,1);
      auVar74 = vpbroadcastd_avx512f(ZEXT416(0x10));
      auVar76._4_4_ = (uint)((byte)(uVar67 >> 1) & 1) * auVar74._4_4_;
      auVar76._0_4_ = (uint)((byte)uVar67 & 1) * auVar74._0_4_;
      auVar76._8_4_ = (uint)((byte)(uVar67 >> 2) & 1) * auVar74._8_4_;
      auVar76._12_4_ = (uint)((byte)(uVar67 >> 3) & 1) * auVar74._12_4_;
      auVar76._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar74._16_4_;
      auVar76._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar74._20_4_;
      auVar76._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar74._24_4_;
      auVar76._28_4_ = (uint)((byte)(uVar67 >> 7) & 1) * auVar74._28_4_;
      auVar76._32_4_ = (uint)((byte)(uVar67 >> 8) & 1) * auVar74._32_4_;
      auVar76._36_4_ = (uint)((byte)(uVar67 >> 9) & 1) * auVar74._36_4_;
      auVar76._40_4_ = (uint)((byte)(uVar67 >> 10) & 1) * auVar74._40_4_;
      auVar76._44_4_ = (uint)((byte)(uVar67 >> 0xb) & 1) * auVar74._44_4_;
      auVar76._48_4_ = (uint)((byte)(uVar67 >> 0xc) & 1) * auVar74._48_4_;
      auVar76._52_4_ = (uint)((byte)(uVar67 >> 0xd) & 1) * auVar74._52_4_;
      auVar76._56_4_ = (uint)((byte)(uVar67 >> 0xe) & 1) * auVar74._56_4_;
      auVar76._60_4_ = (uint)(byte)(uVar67 >> 0xf) * auVar74._60_4_;
      local_45c0 = vmovdqa64_avx512f(auVar76);
      uVar67 = vcmpps_avx512f(local_4700,auVar134,5);
      auVar74 = vpbroadcastd_avx512f(ZEXT416(0x30));
      auVar76 = vpbroadcastd_avx512f(ZEXT416(0x20));
      bVar69 = (bool)((byte)uVar67 & 1);
      auVar79._0_4_ = (uint)bVar69 * auVar76._0_4_ | (uint)!bVar69 * auVar74._0_4_;
      bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar79._4_4_ = (uint)bVar69 * auVar76._4_4_ | (uint)!bVar69 * auVar74._4_4_;
      bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar79._8_4_ = (uint)bVar69 * auVar76._8_4_ | (uint)!bVar69 * auVar74._8_4_;
      bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar79._12_4_ = (uint)bVar69 * auVar76._12_4_ | (uint)!bVar69 * auVar74._12_4_;
      bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar79._16_4_ = (uint)bVar69 * auVar76._16_4_ | (uint)!bVar69 * auVar74._16_4_;
      bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar79._20_4_ = (uint)bVar69 * auVar76._20_4_ | (uint)!bVar69 * auVar74._20_4_;
      bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar79._24_4_ = (uint)bVar69 * auVar76._24_4_ | (uint)!bVar69 * auVar74._24_4_;
      bVar69 = (bool)((byte)(uVar67 >> 7) & 1);
      auVar79._28_4_ = (uint)bVar69 * auVar76._28_4_ | (uint)!bVar69 * auVar74._28_4_;
      bVar69 = (bool)((byte)(uVar67 >> 8) & 1);
      auVar79._32_4_ = (uint)bVar69 * auVar76._32_4_ | (uint)!bVar69 * auVar74._32_4_;
      bVar69 = (bool)((byte)(uVar67 >> 9) & 1);
      auVar79._36_4_ = (uint)bVar69 * auVar76._36_4_ | (uint)!bVar69 * auVar74._36_4_;
      bVar69 = (bool)((byte)(uVar67 >> 10) & 1);
      auVar79._40_4_ = (uint)bVar69 * auVar76._40_4_ | (uint)!bVar69 * auVar74._40_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xb) & 1);
      auVar79._44_4_ = (uint)bVar69 * auVar76._44_4_ | (uint)!bVar69 * auVar74._44_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xc) & 1);
      auVar79._48_4_ = (uint)bVar69 * auVar76._48_4_ | (uint)!bVar69 * auVar74._48_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xd) & 1);
      auVar79._52_4_ = (uint)bVar69 * auVar76._52_4_ | (uint)!bVar69 * auVar74._52_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xe) & 1);
      auVar79._56_4_ = (uint)bVar69 * auVar76._56_4_ | (uint)!bVar69 * auVar74._56_4_;
      bVar69 = SUB81(uVar67 >> 0xf,0);
      auVar79._60_4_ = (uint)bVar69 * auVar76._60_4_ | (uint)!bVar69 * auVar74._60_4_;
      local_4580 = vmovdqa64_avx512f(auVar79);
      uVar67 = vcmpps_avx512f(local_46c0,auVar134,5);
      auVar74 = vpbroadcastd_avx512f(ZEXT416(0x50));
      auVar76 = vpbroadcastd_avx512f(ZEXT416(0x40));
      bVar69 = (bool)((byte)uVar67 & 1);
      auVar80._0_4_ = (uint)bVar69 * auVar76._0_4_ | (uint)!bVar69 * auVar74._0_4_;
      bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar80._4_4_ = (uint)bVar69 * auVar76._4_4_ | (uint)!bVar69 * auVar74._4_4_;
      bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar80._8_4_ = (uint)bVar69 * auVar76._8_4_ | (uint)!bVar69 * auVar74._8_4_;
      bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar80._12_4_ = (uint)bVar69 * auVar76._12_4_ | (uint)!bVar69 * auVar74._12_4_;
      bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar80._16_4_ = (uint)bVar69 * auVar76._16_4_ | (uint)!bVar69 * auVar74._16_4_;
      bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar80._20_4_ = (uint)bVar69 * auVar76._20_4_ | (uint)!bVar69 * auVar74._20_4_;
      bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar80._24_4_ = (uint)bVar69 * auVar76._24_4_ | (uint)!bVar69 * auVar74._24_4_;
      bVar69 = (bool)((byte)(uVar67 >> 7) & 1);
      auVar80._28_4_ = (uint)bVar69 * auVar76._28_4_ | (uint)!bVar69 * auVar74._28_4_;
      bVar69 = (bool)((byte)(uVar67 >> 8) & 1);
      auVar80._32_4_ = (uint)bVar69 * auVar76._32_4_ | (uint)!bVar69 * auVar74._32_4_;
      bVar69 = (bool)((byte)(uVar67 >> 9) & 1);
      auVar80._36_4_ = (uint)bVar69 * auVar76._36_4_ | (uint)!bVar69 * auVar74._36_4_;
      bVar69 = (bool)((byte)(uVar67 >> 10) & 1);
      auVar80._40_4_ = (uint)bVar69 * auVar76._40_4_ | (uint)!bVar69 * auVar74._40_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xb) & 1);
      auVar80._44_4_ = (uint)bVar69 * auVar76._44_4_ | (uint)!bVar69 * auVar74._44_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xc) & 1);
      auVar80._48_4_ = (uint)bVar69 * auVar76._48_4_ | (uint)!bVar69 * auVar74._48_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xd) & 1);
      auVar80._52_4_ = (uint)bVar69 * auVar76._52_4_ | (uint)!bVar69 * auVar74._52_4_;
      bVar69 = (bool)((byte)(uVar67 >> 0xe) & 1);
      auVar80._56_4_ = (uint)bVar69 * auVar76._56_4_ | (uint)!bVar69 * auVar74._56_4_;
      bVar69 = SUB81(uVar67 >> 0xf,0);
      auVar80._60_4_ = (uint)bVar69 * auVar76._60_4_ | (uint)!bVar69 * auVar74._60_4_;
      local_4540 = vmovdqa64_avx512f(auVar80);
      auVar76 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      auVar74 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar134);
      bVar69 = (bool)((byte)uVar70 & 1);
      local_4500 = (uint)bVar69 * auVar74._0_4_ | (uint)!bVar69 * auVar76._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      uStack_44fc = (uint)bVar69 * auVar74._4_4_ | (uint)!bVar69 * auVar76._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      uStack_44f8 = (uint)bVar69 * auVar74._8_4_ | (uint)!bVar69 * auVar76._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      uStack_44f4 = (uint)bVar69 * auVar74._12_4_ | (uint)!bVar69 * auVar76._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      uStack_44f0 = (uint)bVar69 * auVar74._16_4_ | (uint)!bVar69 * auVar76._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      uStack_44ec = (uint)bVar69 * auVar74._20_4_ | (uint)!bVar69 * auVar76._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      uStack_44e8 = (uint)bVar69 * auVar74._24_4_ | (uint)!bVar69 * auVar76._24_4_;
      bVar69 = (bool)((byte)(uVar70 >> 7) & 1);
      uStack_44e4 = (uint)bVar69 * auVar74._28_4_ | (uint)!bVar69 * auVar76._28_4_;
      bVar12 = (byte)(uVar70 >> 8);
      bVar69 = (bool)(bVar12 & 1);
      uStack_44e0 = (uint)bVar69 * auVar74._32_4_ | (uint)!bVar69 * auVar76._32_4_;
      bVar69 = (bool)((byte)(uVar70 >> 9) & 1);
      uStack_44dc = (uint)bVar69 * auVar74._36_4_ | (uint)!bVar69 * auVar76._36_4_;
      bVar69 = (bool)((byte)(uVar70 >> 10) & 1);
      uStack_44d8 = (uint)bVar69 * auVar74._40_4_ | (uint)!bVar69 * auVar76._40_4_;
      bVar69 = (bool)((byte)(uVar70 >> 0xb) & 1);
      uStack_44d4 = (uint)bVar69 * auVar74._44_4_ | (uint)!bVar69 * auVar76._44_4_;
      bVar69 = (bool)((byte)(uVar70 >> 0xc) & 1);
      uStack_44d0 = (uint)bVar69 * auVar74._48_4_ | (uint)!bVar69 * auVar76._48_4_;
      bVar69 = (bool)((byte)(uVar70 >> 0xd) & 1);
      uStack_44cc = (uint)bVar69 * auVar74._52_4_ | (uint)!bVar69 * auVar76._52_4_;
      bVar69 = (bool)((byte)(uVar70 >> 0xe) & 1);
      uStack_44c8 = (uint)bVar69 * auVar74._56_4_ | (uint)!bVar69 * auVar76._56_4_;
      bVar69 = SUB81(uVar70 >> 0xf,0);
      uStack_44c4 = (uint)bVar69 * auVar74._60_4_ | (uint)!bVar69 * auVar76._60_4_;
      auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar134 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar134);
      bVar69 = (bool)((byte)uVar70 & 1);
      bVar5 = (bool)((byte)(uVar70 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar70 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar70 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar70 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar70 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar70 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar70 >> 7) & 1);
      bVar13 = (bool)(bVar12 & 1);
      bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
      bVar15 = (bool)((byte)(uVar70 >> 10) & 1);
      bVar16 = (bool)((byte)(uVar70 >> 0xb) & 1);
      bVar17 = (bool)((byte)(uVar70 >> 0xc) & 1);
      bVar18 = (bool)((byte)(uVar70 >> 0xd) & 1);
      bVar19 = (bool)((byte)(uVar70 >> 0xe) & 1);
      bVar20 = SUB81(uVar70 >> 0xf,0);
      local_44c0 = (uint)bVar69 * auVar134._0_4_ | (uint)!bVar69 * auVar74._0_4_;
      uStack_44bc = (uint)bVar5 * auVar134._4_4_ | (uint)!bVar5 * auVar74._4_4_;
      uStack_44b8 = (uint)bVar6 * auVar134._8_4_ | (uint)!bVar6 * auVar74._8_4_;
      uStack_44b4 = (uint)bVar7 * auVar134._12_4_ | (uint)!bVar7 * auVar74._12_4_;
      uStack_44b0 = (uint)bVar8 * auVar134._16_4_ | (uint)!bVar8 * auVar74._16_4_;
      uStack_44ac = (uint)bVar9 * auVar134._20_4_ | (uint)!bVar9 * auVar74._20_4_;
      uStack_44a8 = (uint)bVar10 * auVar134._24_4_ | (uint)!bVar10 * auVar74._24_4_;
      uStack_44a4 = (uint)bVar11 * auVar134._28_4_ | (uint)!bVar11 * auVar74._28_4_;
      uStack_44a0 = (uint)bVar13 * auVar134._32_4_ | (uint)!bVar13 * auVar74._32_4_;
      uStack_449c = (uint)bVar14 * auVar134._36_4_ | (uint)!bVar14 * auVar74._36_4_;
      uStack_4498 = (uint)bVar15 * auVar134._40_4_ | (uint)!bVar15 * auVar74._40_4_;
      uStack_4494 = (uint)bVar16 * auVar134._44_4_ | (uint)!bVar16 * auVar74._44_4_;
      uStack_4490 = (uint)bVar17 * auVar134._48_4_ | (uint)!bVar17 * auVar74._48_4_;
      uStack_448c = (uint)bVar18 * auVar134._52_4_ | (uint)!bVar18 * auVar74._52_4_;
      uStack_4488 = (uint)bVar19 * auVar134._56_4_ | (uint)!bVar19 * auVar74._56_4_;
      uStack_4484 = (uint)bVar20 * auVar134._60_4_ | (uint)!bVar20 * auVar74._60_4_;
      local_5370 = (uint)(ushort)~(ushort)uVar70;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar62 = 0xe;
      }
      else {
        uVar62 = 2;
        if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT) {
          uVar62 = 0xe;
        }
      }
      pRVar1 = ray + 0x200;
      puVar56 = local_4440;
      local_4450 = 0xfffffffffffffff8;
      pauVar68 = (undefined1 (*) [64])local_3c40;
      local_3cc0 = auVar76;
      local_3c80 = local_4500;
      uStack_3c7c = uStack_44fc;
      uStack_3c78 = uStack_44f8;
      uStack_3c74 = uStack_44f4;
      uStack_3c70 = uStack_44f0;
      uStack_3c6c = uStack_44ec;
      uStack_3c68 = uStack_44e8;
      uStack_3c64 = uStack_44e4;
      uStack_3c60 = uStack_44e0;
      uStack_3c5c = uStack_44dc;
      uStack_3c58 = uStack_44d8;
      uStack_3c54 = uStack_44d4;
      uStack_3c50 = uStack_44d0;
      uStack_3c4c = uStack_44cc;
      uStack_3c48 = uStack_44c8;
      uStack_3c44 = uStack_44c4;
      local_4448 = (bvh->root).ptr;
      local_52e0 = (undefined1 (*) [32])local_4e40;
      auVar74 = vbroadcastss_avx512f(ZEXT416(0x34000000));
      auVar73 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
      auVar77 = ZEXT1664(auVar73);
      auVar134 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      do {
        pauVar68 = pauVar68 + -1;
        root.ptr = puVar56[-1];
        puVar56 = puVar56 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0095524a:
          iVar72 = 3;
        }
        else {
          local_51c0 = *pauVar68;
          auVar81._4_4_ = uStack_44bc;
          auVar81._0_4_ = local_44c0;
          auVar81._8_4_ = uStack_44b8;
          auVar81._12_4_ = uStack_44b4;
          auVar81._16_4_ = uStack_44b0;
          auVar81._20_4_ = uStack_44ac;
          auVar81._24_4_ = uStack_44a8;
          auVar81._28_4_ = uStack_44a4;
          auVar81._32_4_ = uStack_44a0;
          auVar81._36_4_ = uStack_449c;
          auVar81._40_4_ = uStack_4498;
          auVar81._44_4_ = uStack_4494;
          auVar81._48_4_ = uStack_4490;
          auVar81._52_4_ = uStack_448c;
          auVar81._56_4_ = uStack_4488;
          auVar81._60_4_ = uStack_4484;
          uVar67 = vcmpps_avx512f(local_51c0,auVar81,1);
          if ((short)uVar67 == 0) {
LAB_00955252:
            iVar72 = 2;
          }
          else {
            uVar65 = (undefined4)uVar67;
            iVar72 = 0;
            if ((uint)POPCOUNT(uVar65) <= uVar62) {
              do {
                k = 0;
                for (uVar54 = uVar67; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000)
                {
                  k = k + 1;
                }
                local_5240._0_8_ = k;
                bVar69 = occluded1(This,bvh,root,k,&local_52f0,ray,
                                   (TravRayK<16,_false> *)&local_48c0.field_0,context);
                uVar53 = 1 << (local_5240._0_4_ & 0x1f);
                if (!bVar69) {
                  uVar53 = 0;
                }
                local_5370 = local_5370 | uVar53;
                uVar67 = uVar67 - 1 & uVar67;
              } while (uVar67 != 0);
              if ((short)local_5370 == -1) {
                iVar72 = 3;
              }
              else {
                auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar69 = (bool)((byte)local_5370 & 1);
                bVar5 = (bool)((byte)(local_5370 >> 1) & 1);
                bVar6 = (bool)((byte)(local_5370 >> 2) & 1);
                bVar7 = (bool)((byte)(local_5370 >> 3) & 1);
                bVar8 = (bool)((byte)(local_5370 >> 4) & 1);
                bVar9 = (bool)((byte)(local_5370 >> 5) & 1);
                bVar10 = (bool)((byte)(local_5370 >> 6) & 1);
                bVar11 = (bool)((byte)(local_5370 >> 7) & 1);
                bVar13 = (bool)((byte)(local_5370 >> 8) & 1);
                bVar14 = (bool)((byte)(local_5370 >> 9) & 1);
                bVar15 = (bool)((byte)(local_5370 >> 10) & 1);
                bVar16 = (bool)((byte)(local_5370 >> 0xb) & 1);
                bVar17 = (bool)((byte)(local_5370 >> 0xc) & 1);
                bVar18 = (bool)((byte)(local_5370 >> 0xd) & 1);
                bVar19 = (bool)((byte)(local_5370 >> 0xe) & 1);
                bVar20 = (bool)((byte)(local_5370 >> 0xf) & 1);
                local_44c0 = (uint)bVar69 * auVar74._0_4_ | !bVar69 * local_44c0;
                uStack_44bc = (uint)bVar5 * auVar74._4_4_ | !bVar5 * uStack_44bc;
                uStack_44b8 = (uint)bVar6 * auVar74._8_4_ | !bVar6 * uStack_44b8;
                uStack_44b4 = (uint)bVar7 * auVar74._12_4_ | !bVar7 * uStack_44b4;
                uStack_44b0 = (uint)bVar8 * auVar74._16_4_ | !bVar8 * uStack_44b0;
                uStack_44ac = (uint)bVar9 * auVar74._20_4_ | !bVar9 * uStack_44ac;
                uStack_44a8 = (uint)bVar10 * auVar74._24_4_ | !bVar10 * uStack_44a8;
                uStack_44a4 = (uint)bVar11 * auVar74._28_4_ | !bVar11 * uStack_44a4;
                uStack_44a0 = (uint)bVar13 * auVar74._32_4_ | !bVar13 * uStack_44a0;
                uStack_449c = (uint)bVar14 * auVar74._36_4_ | !bVar14 * uStack_449c;
                uStack_4498 = (uint)bVar15 * auVar74._40_4_ | !bVar15 * uStack_4498;
                uStack_4494 = (uint)bVar16 * auVar74._44_4_ | !bVar16 * uStack_4494;
                uStack_4490 = (uint)bVar17 * auVar74._48_4_ | !bVar17 * uStack_4490;
                uStack_448c = (uint)bVar18 * auVar74._52_4_ | !bVar18 * uStack_448c;
                uStack_4488 = (uint)bVar19 * auVar74._56_4_ | !bVar19 * uStack_4488;
                uStack_4484 = (uint)bVar20 * auVar74._60_4_ | !bVar20 * uStack_4484;
                iVar72 = 2;
              }
              auVar75 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
              auVar76 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
              auVar74 = vbroadcastss_avx512f(ZEXT416(0x34000000));
              auVar73 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
              auVar77 = ZEXT1664(auVar73);
              auVar134 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            }
            if (uVar62 < (uint)POPCOUNT(uVar65)) {
              do {
                uVar53 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0095524a;
                  auVar82._4_4_ = uStack_44bc;
                  auVar82._0_4_ = local_44c0;
                  auVar82._8_4_ = uStack_44b8;
                  auVar82._12_4_ = uStack_44b4;
                  auVar82._16_4_ = uStack_44b0;
                  auVar82._20_4_ = uStack_44ac;
                  auVar82._24_4_ = uStack_44a8;
                  auVar82._28_4_ = uStack_44a4;
                  auVar82._32_4_ = uStack_44a0;
                  auVar82._36_4_ = uStack_449c;
                  auVar82._40_4_ = uStack_4498;
                  auVar82._44_4_ = uStack_4494;
                  auVar82._48_4_ = uStack_4490;
                  auVar82._52_4_ = uStack_448c;
                  auVar82._56_4_ = uStack_4488;
                  auVar82._60_4_ = uStack_4484;
                  uVar24 = vcmpps_avx512f(local_51c0,auVar82,9);
                  if ((short)uVar24 != 0) {
                    if ((uVar53 & 0xf) == 8) {
                      local_5354 = local_5370 ^ 0xffff;
                      auVar73 = vcvtusi2ss_avx512f(in_ZMM16._0_16_,
                                                   *(int *)(local_52f0.super_Precalculations.grid +
                                                           8) + -1);
                      auVar78 = vbroadcastss_avx512f(auVar73);
                      auVar79 = vmulps_avx512f(auVar78,*(undefined1 (*) [64])(ray + 0x1c0));
                      auVar78 = vrndscaleps_avx512f(auVar79,1);
                      auVar80 = vbroadcastss_avx512f(ZEXT416((uint)(auVar73._0_4_ + -1.0)));
                      auVar78 = vminps_avx512f(auVar78,auVar80);
                      auVar80 = vmaxps_avx512f(auVar78,auVar77);
                      local_5040 = vcvtps2dq_avx512f(auVar80);
                      auVar78 = local_5040;
                      uVar53 = local_5370;
                      if ((short)local_5370 != -1) {
                        local_49c0 = vsubps_avx512f(auVar79,auVar80);
                        auVar79 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                        local_4a00 = vsubps_avx512f(auVar79,local_49c0);
                        local_4dc0 = local_5040._0_8_;
                        uStack_4db8 = local_5040._8_8_;
                        uStack_4db0 = local_5040._16_8_;
                        uStack_4da8 = local_5040._24_8_;
                        uStack_4da0 = local_5040._32_8_;
                        uStack_4d98 = local_5040._40_8_;
                        uStack_4d90 = local_5040._48_8_;
                        uStack_4d88 = local_5040._56_8_;
                        uVar67 = root.ptr >> 2 & 0xfffffffffffffffc;
                        local_5040 = auVar78;
                        uVar53 = local_5354;
                        do {
                          uVar48 = 0;
                          for (uVar47 = uVar53; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x80000000
                              ) {
                            uVar48 = uVar48 + 1;
                          }
                          auVar78 = vpbroadcastd_avx512f();
                          auVar83._8_8_ = uStack_4db8;
                          auVar83._0_8_ = local_4dc0;
                          auVar83._16_8_ = uStack_4db0;
                          auVar83._24_8_ = uStack_4da8;
                          auVar83._32_8_ = uStack_4da0;
                          auVar83._40_8_ = uStack_4d98;
                          auVar83._48_8_ = uStack_4d90;
                          auVar83._56_8_ = uStack_4d88;
                          uVar24 = vpcmpeqd_avx512f(auVar78,auVar83);
                          uVar47 = (uint)uVar24 & uVar53;
                          uVar50 = CONCAT44(0,*(uint *)(local_52f0.super_Precalculations.grid + 0x14
                                                       ));
                          uVar64 = (ulong)*(uint *)(local_52f0.super_Precalculations.grid + 0xc);
                          uVar54 = (ulong)*(uint *)(local_52f0.super_Precalculations.grid + 0x24);
                          local_5240._0_8_ = local_52f0.super_Precalculations.grid;
                          lVar57 = (ulong)*(uint *)(local_52f0.super_Precalculations.grid + 0x28) *
                                   (long)*(int *)(local_5040 + (ulong)uVar48 * 4);
                          uVar71 = (ulong)(*(uint *)(local_52f0.super_Precalculations.grid + 0x28) &
                                          0xfffffffc);
                          lVar55 = uVar71 + uVar54 + lVar57;
                          lVar63 = uVar50 * 0xc + lVar55;
                          local_5320 = local_52f0.super_Precalculations.grid +
                                       lVar63 + uVar64 * 4 + uVar67;
                          local_5180._0_8_ = uVar50;
                          lVar60 = lVar57 + uVar50 * 8 + uVar54;
                          lVar66 = uVar71 + lVar60;
                          local_52a0 = local_52f0.super_Precalculations.grid +
                                       lVar66 + uVar64 * 4 + uVar67;
                          lVar59 = lVar55 + uVar50 * 4;
                          local_52a8 = local_52f0.super_Precalculations.grid +
                                       lVar59 + uVar64 * 4 + uVar67;
                          local_52b0 = local_52f0.super_Precalculations.grid +
                                       lVar55 + uVar64 * 4 + uVar67;
                          lVar46 = uVar67 + 0x30;
                          local_52b8 = local_52f0.super_Precalculations.grid +
                                       uVar54 + lVar57 + uVar64 * 4 + lVar46;
                          local_52c0 = local_52f0.super_Precalculations.grid +
                                       lVar60 + uVar64 * 4 + lVar46;
                          lVar51 = lVar57 + uVar50 * 4 + uVar54;
                          local_52d0 = local_52f0.super_Precalculations.grid +
                                       lVar51 + uVar64 * 4 + lVar46;
                          local_5318 = local_52f0.super_Precalculations.grid + lVar63 + lVar46;
                          pGVar61 = local_52f0.super_Precalculations.grid + lVar66 + lVar46;
                          local_5308 = local_52f0.super_Precalculations.grid + lVar59 + lVar46;
                          local_5368 = local_52f0.super_Precalculations.grid + lVar55 + lVar46;
                          local_5298 = local_52f0.super_Precalculations.grid + lVar60 + lVar46;
                          local_52c8 = local_52f0.super_Precalculations.grid + lVar51 + lVar46;
                          uVar48 = ~uVar47;
                          pGVar58 = local_52f0.super_Precalculations.grid + lVar57;
                          iVar72 = *(int *)(local_52f0.super_Precalculations.grid + 0x10);
                          local_5250 = (ulong)(uVar64 != 2) * 4 + 4;
                          local_5260 = uVar64 * 4;
                          local_52d8 = 0;
                          do {
                            local_5248 = pGVar58 + uVar54 + 0x2c + uVar67;
                            lVar59 = 0;
                            local_5258 = pGVar58;
                            do {
                              auVar73 = auVar77._0_16_;
                              if (local_5250 == lVar59) break;
                              uVar65 = *(undefined4 *)(local_5368 + lVar59 + -4);
                              auVar84._4_4_ = uVar65;
                              auVar84._0_4_ = uVar65;
                              auVar84._8_4_ = uVar65;
                              auVar84._12_4_ = uVar65;
                              auVar84._16_4_ = uVar65;
                              auVar84._20_4_ = uVar65;
                              auVar84._24_4_ = uVar65;
                              auVar84._28_4_ = uVar65;
                              auVar84._32_4_ = uVar65;
                              auVar84._36_4_ = uVar65;
                              auVar84._40_4_ = uVar65;
                              auVar84._44_4_ = uVar65;
                              auVar84._48_4_ = uVar65;
                              auVar84._52_4_ = uVar65;
                              auVar84._56_4_ = uVar65;
                              auVar84._60_4_ = uVar65;
                              auVar78 = vmulps_avx512f(local_49c0,auVar84);
                              uVar65 = *(undefined4 *)(local_5308 + lVar59 + -4);
                              auVar85._4_4_ = uVar65;
                              auVar85._0_4_ = uVar65;
                              auVar85._8_4_ = uVar65;
                              auVar85._12_4_ = uVar65;
                              auVar85._16_4_ = uVar65;
                              auVar85._20_4_ = uVar65;
                              auVar85._24_4_ = uVar65;
                              auVar85._28_4_ = uVar65;
                              auVar85._32_4_ = uVar65;
                              auVar85._36_4_ = uVar65;
                              auVar85._40_4_ = uVar65;
                              auVar85._44_4_ = uVar65;
                              auVar85._48_4_ = uVar65;
                              auVar85._52_4_ = uVar65;
                              auVar85._56_4_ = uVar65;
                              auVar85._60_4_ = uVar65;
                              auVar79 = vmulps_avx512f(local_49c0,auVar85);
                              uVar65 = *(undefined4 *)(pGVar61 + lVar59 + -4);
                              auVar86._4_4_ = uVar65;
                              auVar86._0_4_ = uVar65;
                              auVar86._8_4_ = uVar65;
                              auVar86._12_4_ = uVar65;
                              auVar86._16_4_ = uVar65;
                              auVar86._20_4_ = uVar65;
                              auVar86._24_4_ = uVar65;
                              auVar86._28_4_ = uVar65;
                              auVar86._32_4_ = uVar65;
                              auVar86._36_4_ = uVar65;
                              auVar86._40_4_ = uVar65;
                              auVar86._44_4_ = uVar65;
                              auVar86._48_4_ = uVar65;
                              auVar86._52_4_ = uVar65;
                              auVar86._56_4_ = uVar65;
                              auVar86._60_4_ = uVar65;
                              auVar80 = vmulps_avx512f(local_49c0,auVar86);
                              uVar65 = *(undefined4 *)(local_5248 + lVar59);
                              auVar87._4_4_ = uVar65;
                              auVar87._0_4_ = uVar65;
                              auVar87._8_4_ = uVar65;
                              auVar87._12_4_ = uVar65;
                              auVar87._16_4_ = uVar65;
                              auVar87._20_4_ = uVar65;
                              auVar87._24_4_ = uVar65;
                              auVar87._28_4_ = uVar65;
                              auVar87._32_4_ = uVar65;
                              auVar87._36_4_ = uVar65;
                              auVar87._40_4_ = uVar65;
                              auVar87._44_4_ = uVar65;
                              auVar87._48_4_ = uVar65;
                              auVar87._52_4_ = uVar65;
                              auVar87._56_4_ = uVar65;
                              auVar87._60_4_ = uVar65;
                              auVar85 = vfmadd231ps_avx512f(auVar78,local_4a00,auVar87);
                              uVar65 = *(undefined4 *)(local_52c8 + lVar59 + -4);
                              auVar89._4_4_ = uVar65;
                              auVar89._0_4_ = uVar65;
                              auVar89._8_4_ = uVar65;
                              auVar89._12_4_ = uVar65;
                              auVar89._16_4_ = uVar65;
                              auVar89._20_4_ = uVar65;
                              auVar89._24_4_ = uVar65;
                              auVar89._28_4_ = uVar65;
                              auVar89._32_4_ = uVar65;
                              auVar89._36_4_ = uVar65;
                              auVar89._40_4_ = uVar65;
                              auVar89._44_4_ = uVar65;
                              auVar89._48_4_ = uVar65;
                              auVar89._52_4_ = uVar65;
                              auVar89._56_4_ = uVar65;
                              auVar89._60_4_ = uVar65;
                              auVar86 = vfmadd231ps_avx512f(auVar79,local_4a00,auVar89);
                              uVar65 = *(undefined4 *)(local_5298 + lVar59 + -4);
                              auVar90._4_4_ = uVar65;
                              auVar90._0_4_ = uVar65;
                              auVar90._8_4_ = uVar65;
                              auVar90._12_4_ = uVar65;
                              auVar90._16_4_ = uVar65;
                              auVar90._20_4_ = uVar65;
                              auVar90._24_4_ = uVar65;
                              auVar90._28_4_ = uVar65;
                              auVar90._32_4_ = uVar65;
                              auVar90._36_4_ = uVar65;
                              auVar90._40_4_ = uVar65;
                              auVar90._44_4_ = uVar65;
                              auVar90._48_4_ = uVar65;
                              auVar90._52_4_ = uVar65;
                              auVar90._56_4_ = uVar65;
                              auVar90._60_4_ = uVar65;
                              auVar87 = vfmadd231ps_avx512f(auVar80,local_4a00,auVar90);
                              uVar65 = *(undefined4 *)(local_5368 + lVar59);
                              auVar91._4_4_ = uVar65;
                              auVar91._0_4_ = uVar65;
                              auVar91._8_4_ = uVar65;
                              auVar91._12_4_ = uVar65;
                              auVar91._16_4_ = uVar65;
                              auVar91._20_4_ = uVar65;
                              auVar91._24_4_ = uVar65;
                              auVar91._28_4_ = uVar65;
                              auVar91._32_4_ = uVar65;
                              auVar91._36_4_ = uVar65;
                              auVar91._40_4_ = uVar65;
                              auVar91._44_4_ = uVar65;
                              auVar91._48_4_ = uVar65;
                              auVar91._52_4_ = uVar65;
                              auVar91._56_4_ = uVar65;
                              auVar91._60_4_ = uVar65;
                              auVar78 = vmulps_avx512f(local_49c0,auVar91);
                              uVar65 = *(undefined4 *)(local_5308 + lVar59);
                              auVar92._4_4_ = uVar65;
                              auVar92._0_4_ = uVar65;
                              auVar92._8_4_ = uVar65;
                              auVar92._12_4_ = uVar65;
                              auVar92._16_4_ = uVar65;
                              auVar92._20_4_ = uVar65;
                              auVar92._24_4_ = uVar65;
                              auVar92._28_4_ = uVar65;
                              auVar92._32_4_ = uVar65;
                              auVar92._36_4_ = uVar65;
                              auVar92._40_4_ = uVar65;
                              auVar92._44_4_ = uVar65;
                              auVar92._48_4_ = uVar65;
                              auVar92._52_4_ = uVar65;
                              auVar92._56_4_ = uVar65;
                              auVar92._60_4_ = uVar65;
                              auVar79 = vmulps_avx512f(local_49c0,auVar92);
                              uVar65 = *(undefined4 *)(pGVar61 + lVar59);
                              auVar93._4_4_ = uVar65;
                              auVar93._0_4_ = uVar65;
                              auVar93._8_4_ = uVar65;
                              auVar93._12_4_ = uVar65;
                              auVar93._16_4_ = uVar65;
                              auVar93._20_4_ = uVar65;
                              auVar93._24_4_ = uVar65;
                              auVar93._28_4_ = uVar65;
                              auVar93._32_4_ = uVar65;
                              auVar93._36_4_ = uVar65;
                              auVar93._40_4_ = uVar65;
                              auVar93._44_4_ = uVar65;
                              auVar93._48_4_ = uVar65;
                              auVar93._52_4_ = uVar65;
                              auVar93._56_4_ = uVar65;
                              auVar93._60_4_ = uVar65;
                              auVar80 = vmulps_avx512f(local_49c0,auVar93);
                              uVar65 = *(undefined4 *)(local_5248 + lVar59 + 4);
                              auVar94._4_4_ = uVar65;
                              auVar94._0_4_ = uVar65;
                              auVar94._8_4_ = uVar65;
                              auVar94._12_4_ = uVar65;
                              auVar94._16_4_ = uVar65;
                              auVar94._20_4_ = uVar65;
                              auVar94._24_4_ = uVar65;
                              auVar94._28_4_ = uVar65;
                              auVar94._32_4_ = uVar65;
                              auVar94._36_4_ = uVar65;
                              auVar94._40_4_ = uVar65;
                              auVar94._44_4_ = uVar65;
                              auVar94._48_4_ = uVar65;
                              auVar94._52_4_ = uVar65;
                              auVar94._56_4_ = uVar65;
                              auVar94._60_4_ = uVar65;
                              auVar84 = vfmadd231ps_avx512f(auVar78,local_4a00,auVar94);
                              uVar65 = *(undefined4 *)(local_52c8 + lVar59);
                              auVar95._4_4_ = uVar65;
                              auVar95._0_4_ = uVar65;
                              auVar95._8_4_ = uVar65;
                              auVar95._12_4_ = uVar65;
                              auVar95._16_4_ = uVar65;
                              auVar95._20_4_ = uVar65;
                              auVar95._24_4_ = uVar65;
                              auVar95._28_4_ = uVar65;
                              auVar95._32_4_ = uVar65;
                              auVar95._36_4_ = uVar65;
                              auVar95._40_4_ = uVar65;
                              auVar95._44_4_ = uVar65;
                              auVar95._48_4_ = uVar65;
                              auVar95._52_4_ = uVar65;
                              auVar95._56_4_ = uVar65;
                              auVar95._60_4_ = uVar65;
                              local_5240 = vfmadd231ps_avx512f(auVar79,local_4a00,auVar95);
                              uVar65 = *(undefined4 *)(local_5298 + lVar59);
                              auVar96._4_4_ = uVar65;
                              auVar96._0_4_ = uVar65;
                              auVar96._8_4_ = uVar65;
                              auVar96._12_4_ = uVar65;
                              auVar96._16_4_ = uVar65;
                              auVar96._20_4_ = uVar65;
                              auVar96._24_4_ = uVar65;
                              auVar96._28_4_ = uVar65;
                              auVar96._32_4_ = uVar65;
                              auVar96._36_4_ = uVar65;
                              auVar96._40_4_ = uVar65;
                              auVar96._44_4_ = uVar65;
                              auVar96._48_4_ = uVar65;
                              auVar96._52_4_ = uVar65;
                              auVar96._56_4_ = uVar65;
                              auVar96._60_4_ = uVar65;
                              local_51c0 = vfmadd231ps_avx512f(auVar80,local_4a00,auVar96);
                              uVar65 = *(undefined4 *)(local_52b0 + lVar59 + 0x2c);
                              auVar97._4_4_ = uVar65;
                              auVar97._0_4_ = uVar65;
                              auVar97._8_4_ = uVar65;
                              auVar97._12_4_ = uVar65;
                              auVar97._16_4_ = uVar65;
                              auVar97._20_4_ = uVar65;
                              auVar97._24_4_ = uVar65;
                              auVar97._28_4_ = uVar65;
                              auVar97._32_4_ = uVar65;
                              auVar97._36_4_ = uVar65;
                              auVar97._40_4_ = uVar65;
                              auVar97._44_4_ = uVar65;
                              auVar97._48_4_ = uVar65;
                              auVar97._52_4_ = uVar65;
                              auVar97._56_4_ = uVar65;
                              auVar97._60_4_ = uVar65;
                              auVar78 = vmulps_avx512f(local_49c0,auVar97);
                              uVar65 = *(undefined4 *)(local_52a8 + lVar59 + 0x2c);
                              auVar98._4_4_ = uVar65;
                              auVar98._0_4_ = uVar65;
                              auVar98._8_4_ = uVar65;
                              auVar98._12_4_ = uVar65;
                              auVar98._16_4_ = uVar65;
                              auVar98._20_4_ = uVar65;
                              auVar98._24_4_ = uVar65;
                              auVar98._28_4_ = uVar65;
                              auVar98._32_4_ = uVar65;
                              auVar98._36_4_ = uVar65;
                              auVar98._40_4_ = uVar65;
                              auVar98._44_4_ = uVar65;
                              auVar98._48_4_ = uVar65;
                              auVar98._52_4_ = uVar65;
                              auVar98._56_4_ = uVar65;
                              auVar98._60_4_ = uVar65;
                              auVar79 = vmulps_avx512f(local_49c0,auVar98);
                              uVar65 = *(undefined4 *)(local_52a0 + lVar59 + 0x2c);
                              auVar99._4_4_ = uVar65;
                              auVar99._0_4_ = uVar65;
                              auVar99._8_4_ = uVar65;
                              auVar99._12_4_ = uVar65;
                              auVar99._16_4_ = uVar65;
                              auVar99._20_4_ = uVar65;
                              auVar99._24_4_ = uVar65;
                              auVar99._28_4_ = uVar65;
                              auVar99._32_4_ = uVar65;
                              auVar99._36_4_ = uVar65;
                              auVar99._40_4_ = uVar65;
                              auVar99._44_4_ = uVar65;
                              auVar99._48_4_ = uVar65;
                              auVar99._52_4_ = uVar65;
                              auVar99._56_4_ = uVar65;
                              auVar99._60_4_ = uVar65;
                              auVar80 = vmulps_avx512f(local_49c0,auVar99);
                              uVar65 = *(undefined4 *)(local_52b8 + lVar59 + -4);
                              auVar100._4_4_ = uVar65;
                              auVar100._0_4_ = uVar65;
                              auVar100._8_4_ = uVar65;
                              auVar100._12_4_ = uVar65;
                              auVar100._16_4_ = uVar65;
                              auVar100._20_4_ = uVar65;
                              auVar100._24_4_ = uVar65;
                              auVar100._28_4_ = uVar65;
                              auVar100._32_4_ = uVar65;
                              auVar100._36_4_ = uVar65;
                              auVar100._40_4_ = uVar65;
                              auVar100._44_4_ = uVar65;
                              auVar100._48_4_ = uVar65;
                              auVar100._52_4_ = uVar65;
                              auVar100._56_4_ = uVar65;
                              auVar100._60_4_ = uVar65;
                              local_5180 = vfmadd231ps_avx512f(auVar78,local_4a00,auVar100);
                              uVar65 = *(undefined4 *)(local_52d0 + lVar59 + -4);
                              auVar101._4_4_ = uVar65;
                              auVar101._0_4_ = uVar65;
                              auVar101._8_4_ = uVar65;
                              auVar101._12_4_ = uVar65;
                              auVar101._16_4_ = uVar65;
                              auVar101._20_4_ = uVar65;
                              auVar101._24_4_ = uVar65;
                              auVar101._28_4_ = uVar65;
                              auVar101._32_4_ = uVar65;
                              auVar101._36_4_ = uVar65;
                              auVar101._40_4_ = uVar65;
                              auVar101._44_4_ = uVar65;
                              auVar101._48_4_ = uVar65;
                              auVar101._52_4_ = uVar65;
                              auVar101._56_4_ = uVar65;
                              auVar101._60_4_ = uVar65;
                              local_4900 = vfmadd231ps_avx512f(auVar79,local_4a00,auVar101);
                              uVar65 = *(undefined4 *)(local_52c0 + lVar59 + -4);
                              auVar102._4_4_ = uVar65;
                              auVar102._0_4_ = uVar65;
                              auVar102._8_4_ = uVar65;
                              auVar102._12_4_ = uVar65;
                              auVar102._16_4_ = uVar65;
                              auVar102._20_4_ = uVar65;
                              auVar102._24_4_ = uVar65;
                              auVar102._28_4_ = uVar65;
                              auVar102._32_4_ = uVar65;
                              auVar102._36_4_ = uVar65;
                              auVar102._40_4_ = uVar65;
                              auVar102._44_4_ = uVar65;
                              auVar102._48_4_ = uVar65;
                              auVar102._52_4_ = uVar65;
                              auVar102._56_4_ = uVar65;
                              auVar102._60_4_ = uVar65;
                              local_4940 = vfmadd231ps_avx512f(auVar80,local_4a00,auVar102);
                              auVar78 = *(undefined1 (*) [64])ray;
                              auVar79 = *(undefined1 (*) [64])(ray + 0x40);
                              auVar80 = *(undefined1 (*) [64])(ray + 0x80);
                              auVar81 = *(undefined1 (*) [64])(ray + 0x100);
                              auVar82 = *(undefined1 (*) [64])(ray + 0x140);
                              auVar83 = *(undefined1 (*) [64])(ray + 0x180);
                              auVar85 = vsubps_avx512f(auVar85,auVar78);
                              auVar86 = vsubps_avx512f(auVar86,auVar79);
                              auVar87 = vsubps_avx512f(auVar87,auVar80);
                              auVar89 = vsubps_avx512f(auVar84,auVar78);
                              auVar90 = vsubps_avx512f(local_5240,auVar79);
                              auVar91 = vsubps_avx512f(local_51c0,auVar80);
                              auVar78 = vsubps_avx512f(local_5180,auVar78);
                              auVar79 = vsubps_avx512f(local_4900,auVar79);
                              auVar80 = vsubps_avx512f(local_4940,auVar80);
                              auVar92 = vsubps_avx512f(auVar78,auVar85);
                              auVar93 = vsubps_avx512f(auVar79,auVar86);
                              auVar94 = vsubps_avx512f(auVar80,auVar87);
                              auVar95 = vsubps_avx512f(auVar85,auVar89);
                              in_ZMM16 = vsubps_avx512f(auVar86,auVar90);
                              auVar96 = vsubps_avx512f(auVar87,auVar91);
                              auVar97 = vaddps_avx512f(auVar78,auVar85);
                              auVar98 = vaddps_avx512f(auVar79,auVar86);
                              auVar99 = vaddps_avx512f(auVar80,auVar87);
                              auVar100 = vmulps_avx512f(auVar98,auVar94);
                              auVar100 = vfmsub231ps_avx512f(auVar100,auVar93,auVar99);
                              auVar99 = vmulps_avx512f(auVar99,auVar92);
                              auVar99 = vfmsub231ps_avx512f(auVar99,auVar94,auVar97);
                              auVar97 = vmulps_avx512f(auVar97,auVar93);
                              auVar97 = vfmsub231ps_avx512f(auVar97,auVar92,auVar98);
                              auVar97 = vmulps_avx512f(auVar97,auVar83);
                              auVar97 = vfmadd231ps_avx512f(auVar97,auVar82,auVar99);
                              auVar97 = vfmadd231ps_avx512f(auVar97,auVar81,auVar100);
                              auVar98 = vaddps_avx512f(auVar85,auVar89);
                              auVar99 = vaddps_avx512f(auVar86,auVar90);
                              auVar100 = vaddps_avx512f(auVar87,auVar91);
                              auVar101 = vmulps_avx512f(auVar99,auVar96);
                              auVar101 = vfmsub231ps_avx512f(auVar101,in_ZMM16,auVar100);
                              auVar100 = vmulps_avx512f(auVar100,auVar95);
                              auVar100 = vfmsub231ps_avx512f(auVar100,auVar96,auVar98);
                              auVar98 = vmulps_avx512f(auVar98,in_ZMM16);
                              auVar98 = vfmsub231ps_avx512f(auVar98,auVar95,auVar99);
                              uVar65 = *(undefined4 *)(local_52b0 + lVar59 + 0x30);
                              auVar103._4_4_ = uVar65;
                              auVar103._0_4_ = uVar65;
                              auVar103._8_4_ = uVar65;
                              auVar103._12_4_ = uVar65;
                              auVar103._16_4_ = uVar65;
                              auVar103._20_4_ = uVar65;
                              auVar103._24_4_ = uVar65;
                              auVar103._28_4_ = uVar65;
                              auVar103._32_4_ = uVar65;
                              auVar103._36_4_ = uVar65;
                              auVar103._40_4_ = uVar65;
                              auVar103._44_4_ = uVar65;
                              auVar103._48_4_ = uVar65;
                              auVar103._52_4_ = uVar65;
                              auVar103._56_4_ = uVar65;
                              auVar103._60_4_ = uVar65;
                              auVar99 = vmulps_avx512f(local_49c0,auVar103);
                              auVar98 = vmulps_avx512f(auVar98,auVar83);
                              auVar98 = vfmadd231ps_avx512f(auVar98,auVar82,auVar100);
                              auVar100 = vsubps_avx512f(auVar89,auVar78);
                              auVar98 = vfmadd231ps_avx512f(auVar98,auVar81,auVar101);
                              auVar101 = vsubps_avx512f(auVar90,auVar79);
                              auVar78 = vaddps_avx512f(auVar89,auVar78);
                              auVar89 = vsubps_avx512f(auVar91,auVar80);
                              auVar79 = vaddps_avx512f(auVar90,auVar79);
                              auVar80 = vaddps_avx512f(auVar91,auVar80);
                              auVar90 = vmulps_avx512f(auVar79,auVar89);
                              auVar90 = vfmsub231ps_avx512f(auVar90,auVar101,auVar80);
                              auVar80 = vmulps_avx512f(auVar80,auVar100);
                              auVar80 = vfmsub231ps_avx512f(auVar80,auVar89,auVar78);
                              auVar78 = vmulps_avx512f(auVar78,auVar101);
                              auVar78 = vfmsub231ps_avx512f(auVar78,auVar100,auVar79);
                              auVar78 = vmulps_avx512f(auVar78,auVar83);
                              auVar78 = vfmadd231ps_avx512f(auVar78,auVar82,auVar80);
                              auVar78 = vfmadd231ps_avx512f(auVar78,auVar81,auVar90);
                              auVar79 = vaddps_avx512f(auVar97,auVar98);
                              auVar80 = vaddps_avx512f(auVar78,auVar79);
                              auVar79 = vandps_avx512dq(auVar80,auVar75);
                              auVar90 = vmulps_avx512f(auVar79,auVar74);
                              auVar79 = vminps_avx512f(auVar97,auVar98);
                              auVar79 = vminps_avx512f(auVar79,auVar78);
                              auVar91 = vxorps_avx512dq(auVar90,auVar134);
                              uVar24 = vcmpps_avx512f(auVar79,auVar91,5);
                              uVar65 = *(undefined4 *)(local_52a8 + lVar59 + 0x30);
                              auVar104._4_4_ = uVar65;
                              auVar104._0_4_ = uVar65;
                              auVar104._8_4_ = uVar65;
                              auVar104._12_4_ = uVar65;
                              auVar104._16_4_ = uVar65;
                              auVar104._20_4_ = uVar65;
                              auVar104._24_4_ = uVar65;
                              auVar104._28_4_ = uVar65;
                              auVar104._32_4_ = uVar65;
                              auVar104._36_4_ = uVar65;
                              auVar104._40_4_ = uVar65;
                              auVar104._44_4_ = uVar65;
                              auVar104._48_4_ = uVar65;
                              auVar104._52_4_ = uVar65;
                              auVar104._56_4_ = uVar65;
                              auVar104._60_4_ = uVar65;
                              auVar79 = vmulps_avx512f(local_49c0,auVar104);
                              auVar91 = vmaxps_avx512f(auVar97,auVar98);
                              auVar78 = vmaxps_avx512f(auVar91,auVar78);
                              uVar65 = *(undefined4 *)(local_52a0 + lVar59 + 0x30);
                              auVar35._4_4_ = uVar65;
                              auVar35._0_4_ = uVar65;
                              auVar35._8_4_ = uVar65;
                              auVar35._12_4_ = uVar65;
                              auVar35._16_4_ = uVar65;
                              auVar35._20_4_ = uVar65;
                              auVar35._24_4_ = uVar65;
                              auVar35._28_4_ = uVar65;
                              auVar35._32_4_ = uVar65;
                              auVar35._36_4_ = uVar65;
                              auVar35._40_4_ = uVar65;
                              auVar35._44_4_ = uVar65;
                              auVar35._48_4_ = uVar65;
                              auVar35._52_4_ = uVar65;
                              auVar35._56_4_ = uVar65;
                              auVar35._60_4_ = uVar65;
                              auVar91 = vmulps_avx512f(local_49c0,auVar35);
                              uVar65 = *(undefined4 *)(local_52b8 + lVar59);
                              auVar36._4_4_ = uVar65;
                              auVar36._0_4_ = uVar65;
                              auVar36._8_4_ = uVar65;
                              auVar36._12_4_ = uVar65;
                              auVar36._16_4_ = uVar65;
                              auVar36._20_4_ = uVar65;
                              auVar36._24_4_ = uVar65;
                              auVar36._28_4_ = uVar65;
                              auVar36._32_4_ = uVar65;
                              auVar36._36_4_ = uVar65;
                              auVar36._40_4_ = uVar65;
                              auVar36._44_4_ = uVar65;
                              auVar36._48_4_ = uVar65;
                              auVar36._52_4_ = uVar65;
                              auVar36._56_4_ = uVar65;
                              auVar36._60_4_ = uVar65;
                              local_4980 = vfmadd231ps_avx512f(auVar99,local_4a00,auVar36);
                              uVar65 = *(undefined4 *)(local_52d0 + lVar59);
                              auVar37._4_4_ = uVar65;
                              auVar37._0_4_ = uVar65;
                              auVar37._8_4_ = uVar65;
                              auVar37._12_4_ = uVar65;
                              auVar37._16_4_ = uVar65;
                              auVar37._20_4_ = uVar65;
                              auVar37._24_4_ = uVar65;
                              auVar37._28_4_ = uVar65;
                              auVar37._32_4_ = uVar65;
                              auVar37._36_4_ = uVar65;
                              auVar37._40_4_ = uVar65;
                              auVar37._44_4_ = uVar65;
                              auVar37._48_4_ = uVar65;
                              auVar37._52_4_ = uVar65;
                              auVar37._56_4_ = uVar65;
                              auVar37._60_4_ = uVar65;
                              auVar79 = vfmadd231ps_avx512f(auVar79,local_4a00,auVar37);
                              uVar25 = vcmpps_avx512f(auVar78,auVar90,2);
                              uVar65 = *(undefined4 *)(local_52c0 + lVar59);
                              auVar38._4_4_ = uVar65;
                              auVar38._0_4_ = uVar65;
                              auVar38._8_4_ = uVar65;
                              auVar38._12_4_ = uVar65;
                              auVar38._16_4_ = uVar65;
                              auVar38._20_4_ = uVar65;
                              auVar38._24_4_ = uVar65;
                              auVar38._28_4_ = uVar65;
                              auVar38._32_4_ = uVar65;
                              auVar38._36_4_ = uVar65;
                              auVar38._40_4_ = uVar65;
                              auVar38._44_4_ = uVar65;
                              auVar38._48_4_ = uVar65;
                              auVar38._52_4_ = uVar65;
                              auVar38._56_4_ = uVar65;
                              auVar38._60_4_ = uVar65;
                              auVar78 = vfmadd231ps_avx512f(auVar91,local_4a00,auVar38);
                              uVar52 = ((ushort)uVar24 | (ushort)uVar25) & (ushort)uVar47;
                              if (uVar52 != 0) {
                                auVar90 = vmulps_avx512f(in_ZMM16,auVar94);
                                auVar91 = vmulps_avx512f(auVar92,auVar96);
                                auVar99 = vmulps_avx512f(auVar95,auVar93);
                                auVar102 = vmulps_avx512f(auVar101,auVar96);
                                auVar103 = vmulps_avx512f(auVar95,auVar89);
                                auVar104 = vmulps_avx512f(auVar100,in_ZMM16);
                                auVar93 = vfmsub213ps_avx512f(auVar93,auVar96,auVar90);
                                auVar94 = vfmsub213ps_avx512f(auVar94,auVar95,auVar91);
                                auVar92 = vfmsub213ps_avx512f(auVar92,in_ZMM16,auVar99);
                                auVar89 = vfmsub213ps_avx512f(auVar89,in_ZMM16,auVar102);
                                auVar96 = vfmsub213ps_avx512f(auVar100,auVar96,auVar103);
                                auVar95 = vfmsub213ps_avx512f(auVar101,auVar95,auVar104);
                                auVar90 = vandps_avx512dq(auVar90,auVar75);
                                auVar100 = vandps_avx512dq(auVar102,auVar75);
                                uVar50 = vcmpps_avx512f(auVar90,auVar100,1);
                                auVar90 = vandps_avx512dq(auVar91,auVar75);
                                auVar91 = vandps_avx512dq(auVar103,auVar75);
                                uVar64 = vcmpps_avx512f(auVar90,auVar91,1);
                                auVar90 = vandps_avx512dq(auVar99,auVar75);
                                auVar91 = vandps_avx512dq(auVar104,auVar75);
                                uVar71 = vcmpps_avx512f(auVar90,auVar91,1);
                                bVar69 = (bool)((byte)uVar50 & 1);
                                auVar105._0_4_ =
                                     (uint)bVar69 * auVar93._0_4_ | (uint)!bVar69 * auVar89._0_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 1) & 1);
                                auVar105._4_4_ =
                                     (uint)bVar69 * auVar93._4_4_ | (uint)!bVar69 * auVar89._4_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 2) & 1);
                                auVar105._8_4_ =
                                     (uint)bVar69 * auVar93._8_4_ | (uint)!bVar69 * auVar89._8_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 3) & 1);
                                auVar105._12_4_ =
                                     (uint)bVar69 * auVar93._12_4_ | (uint)!bVar69 * auVar89._12_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 4) & 1);
                                auVar105._16_4_ =
                                     (uint)bVar69 * auVar93._16_4_ | (uint)!bVar69 * auVar89._16_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 5) & 1);
                                auVar105._20_4_ =
                                     (uint)bVar69 * auVar93._20_4_ | (uint)!bVar69 * auVar89._20_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 6) & 1);
                                auVar105._24_4_ =
                                     (uint)bVar69 * auVar93._24_4_ | (uint)!bVar69 * auVar89._24_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 7) & 1);
                                auVar105._28_4_ =
                                     (uint)bVar69 * auVar93._28_4_ | (uint)!bVar69 * auVar89._28_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 8) & 1);
                                auVar105._32_4_ =
                                     (uint)bVar69 * auVar93._32_4_ | (uint)!bVar69 * auVar89._32_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 9) & 1);
                                auVar105._36_4_ =
                                     (uint)bVar69 * auVar93._36_4_ | (uint)!bVar69 * auVar89._36_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 10) & 1);
                                auVar105._40_4_ =
                                     (uint)bVar69 * auVar93._40_4_ | (uint)!bVar69 * auVar89._40_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 0xb) & 1);
                                auVar105._44_4_ =
                                     (uint)bVar69 * auVar93._44_4_ | (uint)!bVar69 * auVar89._44_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 0xc) & 1);
                                auVar105._48_4_ =
                                     (uint)bVar69 * auVar93._48_4_ | (uint)!bVar69 * auVar89._48_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 0xd) & 1);
                                auVar105._52_4_ =
                                     (uint)bVar69 * auVar93._52_4_ | (uint)!bVar69 * auVar89._52_4_;
                                bVar69 = (bool)((byte)(uVar50 >> 0xe) & 1);
                                auVar105._56_4_ =
                                     (uint)bVar69 * auVar93._56_4_ | (uint)!bVar69 * auVar89._56_4_;
                                bVar69 = SUB81(uVar50 >> 0xf,0);
                                auVar105._60_4_ =
                                     (uint)bVar69 * auVar93._60_4_ | (uint)!bVar69 * auVar89._60_4_;
                                bVar69 = (bool)((byte)uVar64 & 1);
                                auVar106._0_4_ =
                                     (uint)bVar69 * auVar94._0_4_ | (uint)!bVar69 * auVar96._0_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
                                auVar106._4_4_ =
                                     (uint)bVar69 * auVar94._4_4_ | (uint)!bVar69 * auVar96._4_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
                                auVar106._8_4_ =
                                     (uint)bVar69 * auVar94._8_4_ | (uint)!bVar69 * auVar96._8_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
                                auVar106._12_4_ =
                                     (uint)bVar69 * auVar94._12_4_ | (uint)!bVar69 * auVar96._12_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
                                auVar106._16_4_ =
                                     (uint)bVar69 * auVar94._16_4_ | (uint)!bVar69 * auVar96._16_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
                                auVar106._20_4_ =
                                     (uint)bVar69 * auVar94._20_4_ | (uint)!bVar69 * auVar96._20_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
                                auVar106._24_4_ =
                                     (uint)bVar69 * auVar94._24_4_ | (uint)!bVar69 * auVar96._24_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 7) & 1);
                                auVar106._28_4_ =
                                     (uint)bVar69 * auVar94._28_4_ | (uint)!bVar69 * auVar96._28_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 8) & 1);
                                auVar106._32_4_ =
                                     (uint)bVar69 * auVar94._32_4_ | (uint)!bVar69 * auVar96._32_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 9) & 1);
                                auVar106._36_4_ =
                                     (uint)bVar69 * auVar94._36_4_ | (uint)!bVar69 * auVar96._36_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 10) & 1);
                                auVar106._40_4_ =
                                     (uint)bVar69 * auVar94._40_4_ | (uint)!bVar69 * auVar96._40_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 0xb) & 1);
                                auVar106._44_4_ =
                                     (uint)bVar69 * auVar94._44_4_ | (uint)!bVar69 * auVar96._44_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 0xc) & 1);
                                auVar106._48_4_ =
                                     (uint)bVar69 * auVar94._48_4_ | (uint)!bVar69 * auVar96._48_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 0xd) & 1);
                                auVar106._52_4_ =
                                     (uint)bVar69 * auVar94._52_4_ | (uint)!bVar69 * auVar96._52_4_;
                                bVar69 = (bool)((byte)(uVar64 >> 0xe) & 1);
                                auVar106._56_4_ =
                                     (uint)bVar69 * auVar94._56_4_ | (uint)!bVar69 * auVar96._56_4_;
                                bVar69 = SUB81(uVar64 >> 0xf,0);
                                auVar106._60_4_ =
                                     (uint)bVar69 * auVar94._60_4_ | (uint)!bVar69 * auVar96._60_4_;
                                bVar69 = (bool)((byte)uVar71 & 1);
                                auVar107._0_4_ =
                                     (uint)bVar69 * auVar92._0_4_ | (uint)!bVar69 * auVar95._0_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
                                auVar107._4_4_ =
                                     (uint)bVar69 * auVar92._4_4_ | (uint)!bVar69 * auVar95._4_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
                                auVar107._8_4_ =
                                     (uint)bVar69 * auVar92._8_4_ | (uint)!bVar69 * auVar95._8_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
                                auVar107._12_4_ =
                                     (uint)bVar69 * auVar92._12_4_ | (uint)!bVar69 * auVar95._12_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
                                auVar107._16_4_ =
                                     (uint)bVar69 * auVar92._16_4_ | (uint)!bVar69 * auVar95._16_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
                                auVar107._20_4_ =
                                     (uint)bVar69 * auVar92._20_4_ | (uint)!bVar69 * auVar95._20_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
                                auVar107._24_4_ =
                                     (uint)bVar69 * auVar92._24_4_ | (uint)!bVar69 * auVar95._24_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 7) & 1);
                                auVar107._28_4_ =
                                     (uint)bVar69 * auVar92._28_4_ | (uint)!bVar69 * auVar95._28_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 8) & 1);
                                auVar107._32_4_ =
                                     (uint)bVar69 * auVar92._32_4_ | (uint)!bVar69 * auVar95._32_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 9) & 1);
                                auVar107._36_4_ =
                                     (uint)bVar69 * auVar92._36_4_ | (uint)!bVar69 * auVar95._36_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 10) & 1);
                                auVar107._40_4_ =
                                     (uint)bVar69 * auVar92._40_4_ | (uint)!bVar69 * auVar95._40_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 0xb) & 1);
                                auVar107._44_4_ =
                                     (uint)bVar69 * auVar92._44_4_ | (uint)!bVar69 * auVar95._44_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 0xc) & 1);
                                auVar107._48_4_ =
                                     (uint)bVar69 * auVar92._48_4_ | (uint)!bVar69 * auVar95._48_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 0xd) & 1);
                                auVar107._52_4_ =
                                     (uint)bVar69 * auVar92._52_4_ | (uint)!bVar69 * auVar95._52_4_;
                                bVar69 = (bool)((byte)(uVar71 >> 0xe) & 1);
                                auVar107._56_4_ =
                                     (uint)bVar69 * auVar92._56_4_ | (uint)!bVar69 * auVar95._56_4_;
                                bVar69 = SUB81(uVar71 >> 0xf,0);
                                auVar107._60_4_ =
                                     (uint)bVar69 * auVar92._60_4_ | (uint)!bVar69 * auVar95._60_4_;
                                auVar83 = vmulps_avx512f(auVar83,auVar107);
                                auVar82 = vfmadd213ps_avx512f(auVar82,auVar106,auVar83);
                                auVar81 = vfmadd213ps_avx512f(auVar81,auVar105,auVar82);
                                auVar81 = vaddps_avx512f(auVar81,auVar81);
                                auVar82 = vmulps_avx512f(auVar87,auVar107);
                                auVar82 = vfmadd213ps_avx512f(auVar86,auVar106,auVar82);
                                auVar82 = vfmadd213ps_avx512f(auVar85,auVar105,auVar82);
                                auVar83 = vrcp14ps_avx512f(auVar81);
                                auVar82 = vaddps_avx512f(auVar82,auVar82);
                                auVar39._8_4_ = 0x3f800000;
                                auVar39._0_8_ = &DAT_3f8000003f800000;
                                auVar39._12_4_ = 0x3f800000;
                                auVar39._16_4_ = 0x3f800000;
                                auVar39._20_4_ = 0x3f800000;
                                auVar39._24_4_ = 0x3f800000;
                                auVar39._28_4_ = 0x3f800000;
                                auVar39._32_4_ = 0x3f800000;
                                auVar39._36_4_ = 0x3f800000;
                                auVar39._40_4_ = 0x3f800000;
                                auVar39._44_4_ = 0x3f800000;
                                auVar39._48_4_ = 0x3f800000;
                                auVar39._52_4_ = 0x3f800000;
                                auVar39._56_4_ = 0x3f800000;
                                auVar39._60_4_ = 0x3f800000;
                                auVar85 = vfnmadd213ps_avx512f(auVar83,auVar81,auVar39);
                                auVar83 = vfmadd132ps_avx512f(auVar85,auVar83,auVar83);
                                auVar82 = vmulps_avx512f(auVar82,auVar83);
                                uVar24 = vcmpps_avx512f(auVar82,*(undefined1 (*) [64])(ray + 0x200),
                                                        2);
                                uVar25 = vcmpps_avx512f(auVar82,*(undefined1 (*) [64])(ray + 0xc0),
                                                        0xd);
                                uVar26 = vcmpps_avx512f(auVar81,auVar77,4);
                                uVar52 = uVar52 & (ushort)uVar24 & (ushort)uVar25 & (ushort)uVar26;
                                if (uVar52 != 0) {
                                  local_4a40 = auVar97;
                                  local_4a80 = auVar98;
                                  local_4ac0 = auVar80;
                                  local_4b00 = auVar82;
                                  local_4b40 = auVar105;
                                  local_4b80 = auVar106;
                                  local_4bc0 = auVar107;
                                }
                              }
                              pGVar2 = (context->scene->geometries).items
                                       [*(uint *)(local_52f0.super_Precalculations.grid + 0x18)].ptr
                              ;
                              auVar80 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
                              uVar24 = vptestmd_avx512f(auVar80,*(undefined1 (*) [64])(ray + 0x240))
                              ;
                              uVar52 = (ushort)uVar24 & uVar52;
                              uVar49 = (uint)uVar52;
                              if (uVar52 != 0) {
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar80 = vpbroadcastd_avx512f();
                                  auVar81 = vandps_avx512dq(local_4ac0,auVar75);
                                  auVar41._8_4_ = 0x219392ef;
                                  auVar41._0_8_ = 0x219392ef219392ef;
                                  auVar41._12_4_ = 0x219392ef;
                                  auVar41._16_4_ = 0x219392ef;
                                  auVar41._20_4_ = 0x219392ef;
                                  auVar41._24_4_ = 0x219392ef;
                                  auVar41._28_4_ = 0x219392ef;
                                  auVar41._32_4_ = 0x219392ef;
                                  auVar41._36_4_ = 0x219392ef;
                                  auVar41._40_4_ = 0x219392ef;
                                  auVar41._44_4_ = 0x219392ef;
                                  auVar41._48_4_ = 0x219392ef;
                                  auVar41._52_4_ = 0x219392ef;
                                  auVar41._56_4_ = 0x219392ef;
                                  auVar41._60_4_ = 0x219392ef;
                                  uVar50 = vcmpps_avx512f(auVar81,auVar41,5);
                                  auVar81 = vrcp14ps_avx512f(local_4ac0);
                                  auVar82 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                  auVar83 = vfnmadd213ps_avx512f(auVar81,local_4ac0,auVar82);
                                  auVar81 = vfmadd132ps_avx512f(auVar83,auVar81,auVar81);
                                  auVar111._4_4_ = (uint)((byte)(uVar50 >> 1) & 1) * auVar81._4_4_;
                                  auVar111._0_4_ = (uint)((byte)uVar50 & 1) * auVar81._0_4_;
                                  auVar111._8_4_ = (uint)((byte)(uVar50 >> 2) & 1) * auVar81._8_4_;
                                  auVar111._12_4_ = (uint)((byte)(uVar50 >> 3) & 1) * auVar81._12_4_
                                  ;
                                  auVar111._16_4_ = (uint)((byte)(uVar50 >> 4) & 1) * auVar81._16_4_
                                  ;
                                  auVar111._20_4_ = (uint)((byte)(uVar50 >> 5) & 1) * auVar81._20_4_
                                  ;
                                  auVar111._24_4_ = (uint)((byte)(uVar50 >> 6) & 1) * auVar81._24_4_
                                  ;
                                  auVar111._28_4_ = (uint)((byte)(uVar50 >> 7) & 1) * auVar81._28_4_
                                  ;
                                  auVar111._32_4_ = (uint)((byte)(uVar50 >> 8) & 1) * auVar81._32_4_
                                  ;
                                  auVar111._36_4_ = (uint)((byte)(uVar50 >> 9) & 1) * auVar81._36_4_
                                  ;
                                  auVar111._40_4_ =
                                       (uint)((byte)(uVar50 >> 10) & 1) * auVar81._40_4_;
                                  auVar111._44_4_ =
                                       (uint)((byte)(uVar50 >> 0xb) & 1) * auVar81._44_4_;
                                  auVar111._48_4_ =
                                       (uint)((byte)(uVar50 >> 0xc) & 1) * auVar81._48_4_;
                                  auVar111._52_4_ =
                                       (uint)((byte)(uVar50 >> 0xd) & 1) * auVar81._52_4_;
                                  auVar111._56_4_ =
                                       (uint)((byte)(uVar50 >> 0xe) & 1) * auVar81._56_4_;
                                  auVar111._60_4_ = (uint)(byte)(uVar50 >> 0xf) * auVar81._60_4_;
                                  auVar81 = vmulps_avx512f(auVar111,local_4a40);
                                  auVar81 = vminps_avx512f(auVar81,auVar82);
                                  auVar83 = vmulps_avx512f(auVar111,local_4a80);
                                  auVar83 = vminps_avx512f(auVar83,auVar82);
                                  auVar85 = vpbroadcastd_avx512f
                                                      (ZEXT416(*(uint *)(local_5318 + lVar59 + -4)))
                                  ;
                                  auVar86 = vpbroadcastd_avx512f
                                                      (ZEXT416(*(uint *)(local_5318 + lVar59)));
                                  auVar87 = vpbroadcastd_avx512f
                                                      (ZEXT416(*(uint *)(local_5320 + lVar59 + 0x2c)
                                                              ));
                                  auVar89 = vpsrld_avx512f(auVar85,0x10);
                                  auVar90 = vmovdqu16_avx512bw(auVar77);
                                  auVar112._2_2_ = auVar90._2_2_;
                                  auVar112._0_2_ = auVar85._0_2_;
                                  auVar112._4_2_ = auVar85._4_2_;
                                  auVar112._6_2_ = auVar90._6_2_;
                                  auVar112._8_2_ = auVar85._8_2_;
                                  auVar112._10_2_ = auVar90._10_2_;
                                  auVar112._12_2_ = auVar85._12_2_;
                                  auVar112._14_2_ = auVar90._14_2_;
                                  auVar112._16_2_ = auVar85._16_2_;
                                  auVar112._18_2_ = auVar90._18_2_;
                                  auVar112._20_2_ = auVar85._20_2_;
                                  auVar112._22_2_ = auVar90._22_2_;
                                  auVar112._24_2_ = auVar85._24_2_;
                                  auVar112._26_2_ = auVar90._26_2_;
                                  auVar112._28_2_ = auVar85._28_2_;
                                  auVar112._30_2_ = auVar90._30_2_;
                                  auVar112._32_2_ = auVar85._32_2_;
                                  auVar112._34_2_ = auVar90._34_2_;
                                  auVar112._36_2_ = auVar85._36_2_;
                                  auVar112._38_2_ = auVar90._38_2_;
                                  auVar112._40_2_ = auVar85._40_2_;
                                  auVar112._42_2_ = auVar90._42_2_;
                                  auVar112._44_2_ = auVar85._44_2_;
                                  auVar112._46_2_ = auVar90._46_2_;
                                  auVar112._48_2_ = auVar85._48_2_;
                                  auVar112._50_2_ = auVar90._50_2_;
                                  auVar112._52_2_ = auVar85._52_2_;
                                  auVar112._54_2_ = auVar90._54_2_;
                                  auVar112._56_2_ = auVar85._56_2_;
                                  auVar112._58_2_ = auVar90._58_2_;
                                  auVar112._62_2_ = auVar90._62_2_;
                                  auVar112._60_2_ = auVar85._60_2_;
                                  auVar85 = vcvtdq2ps_avx512f(auVar112);
                                  auVar90 = vbroadcastss_avx512f(ZEXT416(0x39000000));
                                  auVar85 = vmulps_avx512f(auVar85,auVar90);
                                  auVar89 = vcvtdq2ps_avx512f(auVar89);
                                  auVar89 = vmulps_avx512f(auVar89,auVar90);
                                  auVar91 = vpsrld_avx512f(auVar86,0x10);
                                  auVar92 = vmovdqu16_avx512bw(auVar77);
                                  auVar113._2_2_ = auVar92._2_2_;
                                  auVar113._0_2_ = auVar86._0_2_;
                                  auVar113._4_2_ = auVar86._4_2_;
                                  auVar113._6_2_ = auVar92._6_2_;
                                  auVar113._8_2_ = auVar86._8_2_;
                                  auVar113._10_2_ = auVar92._10_2_;
                                  auVar113._12_2_ = auVar86._12_2_;
                                  auVar113._14_2_ = auVar92._14_2_;
                                  auVar113._16_2_ = auVar86._16_2_;
                                  auVar113._18_2_ = auVar92._18_2_;
                                  auVar113._20_2_ = auVar86._20_2_;
                                  auVar113._22_2_ = auVar92._22_2_;
                                  auVar113._24_2_ = auVar86._24_2_;
                                  auVar113._26_2_ = auVar92._26_2_;
                                  auVar113._28_2_ = auVar86._28_2_;
                                  auVar113._30_2_ = auVar92._30_2_;
                                  auVar113._32_2_ = auVar86._32_2_;
                                  auVar113._34_2_ = auVar92._34_2_;
                                  auVar113._36_2_ = auVar86._36_2_;
                                  auVar113._38_2_ = auVar92._38_2_;
                                  auVar113._40_2_ = auVar86._40_2_;
                                  auVar113._42_2_ = auVar92._42_2_;
                                  auVar113._44_2_ = auVar86._44_2_;
                                  auVar113._46_2_ = auVar92._46_2_;
                                  auVar113._48_2_ = auVar86._48_2_;
                                  auVar113._50_2_ = auVar92._50_2_;
                                  auVar113._52_2_ = auVar86._52_2_;
                                  auVar113._54_2_ = auVar92._54_2_;
                                  auVar113._56_2_ = auVar86._56_2_;
                                  auVar113._58_2_ = auVar92._58_2_;
                                  auVar113._62_2_ = auVar92._62_2_;
                                  auVar113._60_2_ = auVar86._60_2_;
                                  auVar86 = vcvtdq2ps_avx512f(auVar113);
                                  auVar86 = vmulps_avx512f(auVar86,auVar90);
                                  auVar91 = vcvtdq2ps_avx512f(auVar91);
                                  auVar91 = vmulps_avx512f(auVar91,auVar90);
                                  auVar82 = vsubps_avx512f(auVar82,auVar81);
                                  auVar82 = vsubps_avx512f(auVar82,auVar83);
                                  auVar85 = vmulps_avx512f(auVar82,auVar85);
                                  auVar82 = vmulps_avx512f(auVar82,auVar89);
                                  auVar89 = vpsrld_avx512f(auVar87,0x10);
                                  auVar92 = vmovdqu16_avx512bw(auVar77);
                                  auVar114._2_2_ = auVar92._2_2_;
                                  auVar114._0_2_ = auVar87._0_2_;
                                  auVar114._4_2_ = auVar87._4_2_;
                                  auVar114._6_2_ = auVar92._6_2_;
                                  auVar114._8_2_ = auVar87._8_2_;
                                  auVar114._10_2_ = auVar92._10_2_;
                                  auVar114._12_2_ = auVar87._12_2_;
                                  auVar114._14_2_ = auVar92._14_2_;
                                  auVar114._16_2_ = auVar87._16_2_;
                                  auVar114._18_2_ = auVar92._18_2_;
                                  auVar114._20_2_ = auVar87._20_2_;
                                  auVar114._22_2_ = auVar92._22_2_;
                                  auVar114._24_2_ = auVar87._24_2_;
                                  auVar114._26_2_ = auVar92._26_2_;
                                  auVar114._28_2_ = auVar87._28_2_;
                                  auVar114._30_2_ = auVar92._30_2_;
                                  auVar114._32_2_ = auVar87._32_2_;
                                  auVar114._34_2_ = auVar92._34_2_;
                                  auVar114._36_2_ = auVar87._36_2_;
                                  auVar114._38_2_ = auVar92._38_2_;
                                  auVar114._40_2_ = auVar87._40_2_;
                                  auVar114._42_2_ = auVar92._42_2_;
                                  auVar114._44_2_ = auVar87._44_2_;
                                  auVar114._46_2_ = auVar92._46_2_;
                                  auVar114._48_2_ = auVar87._48_2_;
                                  auVar114._50_2_ = auVar92._50_2_;
                                  auVar114._52_2_ = auVar87._52_2_;
                                  auVar114._54_2_ = auVar92._54_2_;
                                  auVar114._56_2_ = auVar87._56_2_;
                                  auVar114._58_2_ = auVar92._58_2_;
                                  auVar114._62_2_ = auVar92._62_2_;
                                  auVar114._60_2_ = auVar87._60_2_;
                                  auVar87 = vcvtdq2ps_avx512f(auVar114);
                                  auVar87 = vmulps_avx512f(auVar87,auVar90);
                                  auVar89 = vcvtdq2ps_avx512f(auVar89);
                                  auVar89 = vmulps_avx512f(auVar89,auVar90);
                                  auVar85 = vfmadd231ps_avx512f(auVar85,auVar83,auVar87);
                                  auVar82 = vfmadd231ps_avx512f(auVar82,auVar83,auVar89);
                                  local_4f40 = vfmadd231ps_avx512f(auVar85,auVar81,auVar86);
                                  local_4f00 = vfmadd231ps_avx512f(auVar82,auVar81,auVar91);
                                  auVar81 = vpbroadcastd_avx512f();
                                  pRVar3 = context->user;
                                  local_5000 = local_4b40._0_8_;
                                  uStack_4ff8 = local_4b40._8_8_;
                                  uStack_4ff0 = local_4b40._16_8_;
                                  uStack_4fe8 = local_4b40._24_8_;
                                  uStack_4fe0 = local_4b40._32_8_;
                                  uStack_4fd8 = local_4b40._40_8_;
                                  uStack_4fd0 = local_4b40._48_8_;
                                  uStack_4fc8 = local_4b40._56_8_;
                                  local_4fc0 = local_4b80._0_8_;
                                  uStack_4fb8 = local_4b80._8_8_;
                                  uStack_4fb0 = local_4b80._16_8_;
                                  uStack_4fa8 = local_4b80._24_8_;
                                  uStack_4fa0 = local_4b80._32_8_;
                                  uStack_4f98 = local_4b80._40_8_;
                                  uStack_4f90 = local_4b80._48_8_;
                                  uStack_4f88 = local_4b80._56_8_;
                                  local_4f80 = local_4bc0._0_8_;
                                  uStack_4f78 = local_4bc0._8_8_;
                                  uStack_4f70 = local_4bc0._16_8_;
                                  uStack_4f68 = local_4bc0._24_8_;
                                  uStack_4f60 = local_4bc0._32_8_;
                                  uStack_4f58 = local_4bc0._40_8_;
                                  uStack_4f50 = local_4bc0._48_8_;
                                  uStack_4f48 = local_4bc0._56_8_;
                                  local_4ec0 = vmovdqa64_avx512f(auVar81);
                                  local_4e80 = vmovdqa64_avx512f(auVar80);
                                  auVar21 = vpcmpeqd_avx2(auVar80._0_32_,auVar80._0_32_);
                                  local_52e0[3] = auVar21;
                                  local_52e0[2] = auVar21;
                                  local_52e0[1] = auVar21;
                                  *local_52e0 = auVar21;
                                  local_4e40 = vbroadcastss_avx512f(ZEXT416(pRVar3->instID[0]));
                                  local_4e00 = vbroadcastss_avx512f(ZEXT416(pRVar3->instPrimID[0]));
                                  local_5140 = *(undefined1 (*) [64])(ray + 0x200);
                                  auVar80 = vblendmps_avx512f(local_5140,local_4b00);
                                  bVar69 = (bool)((byte)uVar52 & 1);
                                  bVar5 = (bool)((byte)(uVar52 >> 1) & 1);
                                  bVar6 = (bool)((byte)(uVar52 >> 2) & 1);
                                  bVar7 = (bool)((byte)(uVar52 >> 3) & 1);
                                  bVar8 = (bool)((byte)(uVar52 >> 4) & 1);
                                  bVar9 = (bool)((byte)(uVar52 >> 5) & 1);
                                  bVar10 = (bool)((byte)(uVar52 >> 6) & 1);
                                  bVar11 = (bool)((byte)(uVar52 >> 7) & 1);
                                  bVar12 = (byte)(uVar52 >> 8);
                                  bVar13 = (bool)(bVar12 >> 1 & 1);
                                  bVar14 = (bool)(bVar12 >> 2 & 1);
                                  bVar15 = (bool)(bVar12 >> 3 & 1);
                                  bVar16 = (bool)(bVar12 >> 4 & 1);
                                  bVar17 = (bool)(bVar12 >> 5 & 1);
                                  bVar18 = (bool)(bVar12 >> 6 & 1);
                                  *(uint *)(ray + 0x200) =
                                       (uint)bVar69 * auVar80._0_4_ |
                                       (uint)!bVar69 * local_4e00._0_4_;
                                  *(uint *)(ray + 0x204) =
                                       (uint)bVar5 * auVar80._4_4_ | (uint)!bVar5 * local_4e00._4_4_
                                  ;
                                  *(uint *)(ray + 0x208) =
                                       (uint)bVar6 * auVar80._8_4_ | (uint)!bVar6 * local_4e00._8_4_
                                  ;
                                  *(uint *)(ray + 0x20c) =
                                       (uint)bVar7 * auVar80._12_4_ |
                                       (uint)!bVar7 * local_4e00._12_4_;
                                  *(uint *)(ray + 0x210) =
                                       (uint)bVar8 * auVar80._16_4_ |
                                       (uint)!bVar8 * local_4e00._16_4_;
                                  *(uint *)(ray + 0x214) =
                                       (uint)bVar9 * auVar80._20_4_ |
                                       (uint)!bVar9 * local_4e00._20_4_;
                                  *(uint *)(ray + 0x218) =
                                       (uint)bVar10 * auVar80._24_4_ |
                                       (uint)!bVar10 * local_4e00._24_4_;
                                  *(uint *)(ray + 0x21c) =
                                       (uint)bVar11 * auVar80._28_4_ |
                                       (uint)!bVar11 * local_4e00._28_4_;
                                  *(uint *)(ray + 0x220) =
                                       (uint)(bVar12 & 1) * auVar80._32_4_ |
                                       (uint)!(bool)(bVar12 & 1) * local_4e00._32_4_;
                                  *(uint *)(ray + 0x224) =
                                       (uint)bVar13 * auVar80._36_4_ |
                                       (uint)!bVar13 * local_4e00._36_4_;
                                  *(uint *)(ray + 0x228) =
                                       (uint)bVar14 * auVar80._40_4_ |
                                       (uint)!bVar14 * local_4e00._40_4_;
                                  *(uint *)(ray + 0x22c) =
                                       (uint)bVar15 * auVar80._44_4_ |
                                       (uint)!bVar15 * local_4e00._44_4_;
                                  *(uint *)(ray + 0x230) =
                                       (uint)bVar16 * auVar80._48_4_ |
                                       (uint)!bVar16 * local_4e00._48_4_;
                                  *(uint *)(ray + 0x234) =
                                       (uint)bVar17 * auVar80._52_4_ |
                                       (uint)!bVar17 * local_4e00._52_4_;
                                  *(uint *)(ray + 0x238) =
                                       (uint)bVar18 * auVar80._56_4_ |
                                       (uint)!bVar18 * local_4e00._56_4_;
                                  *(uint *)(ray + 0x23c) =
                                       (uint)(bVar12 >> 7) * auVar80._60_4_ |
                                       (uint)!(bool)(bVar12 >> 7) * local_4e00._60_4_;
                                  auVar80 = vpmovm2d_avx512dq((ulong)uVar52);
                                  local_5200 = vmovdqa64_avx512f(auVar80);
                                  local_5290.valid = (int *)local_5200;
                                  local_5290.geometryUserPtr = pGVar2->userPtr;
                                  local_5290.context = context->user;
                                  local_5290.hit = (RTCHitN *)&local_5000;
                                  local_5290.N = 0x10;
                                  local_5290.ray = (RTCRayN *)ray;
                                  local_5100 = auVar78;
                                  local_50c0 = auVar79;
                                  local_5080 = auVar84;
                                  if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    (*pGVar2->occlusionFilterN)(&local_5290);
                                    auVar134 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                    auVar73 = vxorps_avx512vl(auVar73,auVar73);
                                    auVar77 = ZEXT1664(auVar73);
                                    auVar74 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                    auVar76 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                    auVar75 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                  }
                                  auVar73 = auVar77._0_16_;
                                  auVar78 = vmovdqa64_avx512f(local_5200);
                                  uVar50 = vptestmd_avx512f(auVar78,auVar78);
                                  if ((short)uVar50 != 0) {
                                    p_Var4 = context->args->filter;
                                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var4)(&local_5290);
                                      auVar134 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                      auVar73 = vxorps_avx512vl(auVar73,auVar73);
                                      auVar77 = ZEXT1664(auVar73);
                                      auVar74 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                      auVar76 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                      auVar75 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                    }
                                    auVar78 = vmovdqa64_avx512f(local_5200);
                                    uVar50 = vptestmd_avx512f(auVar78,auVar78);
                                    auVar78 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                    bVar69 = (bool)((byte)uVar50 & 1);
                                    bVar5 = (bool)((byte)(uVar50 >> 1) & 1);
                                    bVar6 = (bool)((byte)(uVar50 >> 2) & 1);
                                    bVar7 = (bool)((byte)(uVar50 >> 3) & 1);
                                    bVar8 = (bool)((byte)(uVar50 >> 4) & 1);
                                    bVar9 = (bool)((byte)(uVar50 >> 5) & 1);
                                    bVar10 = (bool)((byte)(uVar50 >> 6) & 1);
                                    bVar11 = (bool)((byte)(uVar50 >> 7) & 1);
                                    bVar13 = (bool)((byte)(uVar50 >> 8) & 1);
                                    bVar14 = (bool)((byte)(uVar50 >> 9) & 1);
                                    bVar15 = (bool)((byte)(uVar50 >> 10) & 1);
                                    bVar16 = (bool)((byte)(uVar50 >> 0xb) & 1);
                                    bVar17 = (bool)((byte)(uVar50 >> 0xc) & 1);
                                    bVar18 = (bool)((byte)(uVar50 >> 0xd) & 1);
                                    bVar19 = (bool)((byte)(uVar50 >> 0xe) & 1);
                                    bVar20 = SUB81(uVar50 >> 0xf,0);
                                    *(uint *)(local_5290.ray + 0x200) =
                                         (uint)bVar69 * auVar78._0_4_ |
                                         (uint)!bVar69 * *(int *)(local_5290.ray + 0x200);
                                    *(uint *)(local_5290.ray + 0x204) =
                                         (uint)bVar5 * auVar78._4_4_ |
                                         (uint)!bVar5 * *(int *)(local_5290.ray + 0x204);
                                    *(uint *)(local_5290.ray + 0x208) =
                                         (uint)bVar6 * auVar78._8_4_ |
                                         (uint)!bVar6 * *(int *)(local_5290.ray + 0x208);
                                    *(uint *)(local_5290.ray + 0x20c) =
                                         (uint)bVar7 * auVar78._12_4_ |
                                         (uint)!bVar7 * *(int *)(local_5290.ray + 0x20c);
                                    *(uint *)(local_5290.ray + 0x210) =
                                         (uint)bVar8 * auVar78._16_4_ |
                                         (uint)!bVar8 * *(int *)(local_5290.ray + 0x210);
                                    *(uint *)(local_5290.ray + 0x214) =
                                         (uint)bVar9 * auVar78._20_4_ |
                                         (uint)!bVar9 * *(int *)(local_5290.ray + 0x214);
                                    *(uint *)(local_5290.ray + 0x218) =
                                         (uint)bVar10 * auVar78._24_4_ |
                                         (uint)!bVar10 * *(int *)(local_5290.ray + 0x218);
                                    *(uint *)(local_5290.ray + 0x21c) =
                                         (uint)bVar11 * auVar78._28_4_ |
                                         (uint)!bVar11 * *(int *)(local_5290.ray + 0x21c);
                                    *(uint *)(local_5290.ray + 0x220) =
                                         (uint)bVar13 * auVar78._32_4_ |
                                         (uint)!bVar13 * *(int *)(local_5290.ray + 0x220);
                                    *(uint *)(local_5290.ray + 0x224) =
                                         (uint)bVar14 * auVar78._36_4_ |
                                         (uint)!bVar14 * *(int *)(local_5290.ray + 0x224);
                                    *(uint *)(local_5290.ray + 0x228) =
                                         (uint)bVar15 * auVar78._40_4_ |
                                         (uint)!bVar15 * *(int *)(local_5290.ray + 0x228);
                                    *(uint *)(local_5290.ray + 0x22c) =
                                         (uint)bVar16 * auVar78._44_4_ |
                                         (uint)!bVar16 * *(int *)(local_5290.ray + 0x22c);
                                    *(uint *)(local_5290.ray + 0x230) =
                                         (uint)bVar17 * auVar78._48_4_ |
                                         (uint)!bVar17 * *(int *)(local_5290.ray + 0x230);
                                    *(uint *)(local_5290.ray + 0x234) =
                                         (uint)bVar18 * auVar78._52_4_ |
                                         (uint)!bVar18 * *(int *)(local_5290.ray + 0x234);
                                    *(uint *)(local_5290.ray + 0x238) =
                                         (uint)bVar19 * auVar78._56_4_ |
                                         (uint)!bVar19 * *(int *)(local_5290.ray + 0x238);
                                    *(uint *)(local_5290.ray + 0x23c) =
                                         (uint)bVar20 * auVar78._60_4_ |
                                         (uint)!bVar20 * *(int *)(local_5290.ray + 0x23c);
                                  }
                                  uVar49 = (uint)uVar50;
                                  bVar69 = (bool)((byte)uVar50 & 1);
                                  bVar5 = (bool)((byte)(uVar50 >> 1) & 1);
                                  bVar6 = (bool)((byte)(uVar50 >> 2) & 1);
                                  bVar7 = (bool)((byte)(uVar50 >> 3) & 1);
                                  bVar8 = (bool)((byte)(uVar50 >> 4) & 1);
                                  bVar9 = (bool)((byte)(uVar50 >> 5) & 1);
                                  bVar10 = (bool)((byte)(uVar50 >> 6) & 1);
                                  bVar11 = (bool)((byte)(uVar50 >> 7) & 1);
                                  bVar13 = (bool)((byte)(uVar50 >> 8) & 1);
                                  bVar14 = (bool)((byte)(uVar50 >> 9) & 1);
                                  bVar15 = (bool)((byte)(uVar50 >> 10) & 1);
                                  bVar16 = (bool)((byte)(uVar50 >> 0xb) & 1);
                                  bVar17 = (bool)((byte)(uVar50 >> 0xc) & 1);
                                  bVar18 = (bool)((byte)(uVar50 >> 0xd) & 1);
                                  bVar19 = (bool)((byte)(uVar50 >> 0xe) & 1);
                                  bVar20 = SUB81(uVar50 >> 0xf,0);
                                  *(uint *)pRVar1 =
                                       (uint)bVar69 * *(int *)pRVar1 |
                                       (uint)!bVar69 * local_5140._0_4_;
                                  *(uint *)(ray + 0x204) =
                                       (uint)bVar5 * *(int *)(ray + 0x204) |
                                       (uint)!bVar5 * local_5140._4_4_;
                                  *(uint *)(ray + 0x208) =
                                       (uint)bVar6 * *(int *)(ray + 0x208) |
                                       (uint)!bVar6 * local_5140._8_4_;
                                  *(uint *)(ray + 0x20c) =
                                       (uint)bVar7 * *(int *)(ray + 0x20c) |
                                       (uint)!bVar7 * local_5140._12_4_;
                                  *(uint *)(ray + 0x210) =
                                       (uint)bVar8 * *(int *)(ray + 0x210) |
                                       (uint)!bVar8 * local_5140._16_4_;
                                  *(uint *)(ray + 0x214) =
                                       (uint)bVar9 * *(int *)(ray + 0x214) |
                                       (uint)!bVar9 * local_5140._20_4_;
                                  *(uint *)(ray + 0x218) =
                                       (uint)bVar10 * *(int *)(ray + 0x218) |
                                       (uint)!bVar10 * local_5140._24_4_;
                                  *(uint *)(ray + 0x21c) =
                                       (uint)bVar11 * *(int *)(ray + 0x21c) |
                                       (uint)!bVar11 * local_5140._28_4_;
                                  *(uint *)(ray + 0x220) =
                                       (uint)bVar13 * *(int *)(ray + 0x220) |
                                       (uint)!bVar13 * local_5140._32_4_;
                                  *(uint *)(ray + 0x224) =
                                       (uint)bVar14 * *(int *)(ray + 0x224) |
                                       (uint)!bVar14 * local_5140._36_4_;
                                  *(uint *)(ray + 0x228) =
                                       (uint)bVar15 * *(int *)(ray + 0x228) |
                                       (uint)!bVar15 * local_5140._40_4_;
                                  *(uint *)(ray + 0x22c) =
                                       (uint)bVar16 * *(int *)(ray + 0x22c) |
                                       (uint)!bVar16 * local_5140._44_4_;
                                  *(uint *)(ray + 0x230) =
                                       (uint)bVar17 * *(int *)(ray + 0x230) |
                                       (uint)!bVar17 * local_5140._48_4_;
                                  *(uint *)(ray + 0x234) =
                                       (uint)bVar18 * *(int *)(ray + 0x234) |
                                       (uint)!bVar18 * local_5140._52_4_;
                                  *(uint *)(ray + 0x238) =
                                       (uint)bVar19 * *(int *)(ray + 0x238) |
                                       (uint)!bVar19 * local_5140._56_4_;
                                  *(uint *)(ray + 0x23c) =
                                       (uint)bVar20 * *(int *)(ray + 0x23c) |
                                       (uint)!bVar20 * local_5140._60_4_;
                                  auVar78 = local_5100;
                                  auVar84 = local_5080;
                                  auVar79 = local_50c0;
                                }
                                uVar47 = ~uVar49 & uVar47;
                              }
                              auVar73 = auVar77._0_16_;
                              if ((ushort)uVar47 == 0) {
                                bVar69 = false;
                              }
                              else {
                                auVar80 = *(undefined1 (*) [64])ray;
                                auVar81 = *(undefined1 (*) [64])(ray + 0x40);
                                auVar82 = *(undefined1 (*) [64])(ray + 0x80);
                                auVar83 = *(undefined1 (*) [64])(ray + 0x100);
                                auVar85 = *(undefined1 (*) [64])(ray + 0x140);
                                auVar86 = *(undefined1 (*) [64])(ray + 0x180);
                                auVar87 = vsubps_avx512f(local_5180,auVar80);
                                auVar89 = vsubps_avx512f(local_4900,auVar81);
                                auVar90 = vsubps_avx512f(local_4940,auVar82);
                                auVar84 = vsubps_avx512f(auVar84,auVar80);
                                auVar91 = vsubps_avx512f(local_5240,auVar81);
                                auVar92 = vsubps_avx512f(local_51c0,auVar82);
                                auVar80 = vsubps_avx512f(local_4980,auVar80);
                                auVar79 = vsubps_avx512f(auVar79,auVar81);
                                auVar78 = vsubps_avx512f(auVar78,auVar82);
                                auVar81 = vsubps_avx512f(auVar80,auVar87);
                                auVar82 = vsubps_avx512f(auVar79,auVar89);
                                auVar93 = vsubps_avx512f(auVar78,auVar90);
                                auVar94 = vsubps_avx512f(auVar87,auVar84);
                                in_ZMM16 = vsubps_avx512f(auVar89,auVar91);
                                auVar95 = vsubps_avx512f(auVar90,auVar92);
                                auVar96 = vsubps_avx512f(auVar84,auVar80);
                                auVar97 = vsubps_avx512f(auVar91,auVar79);
                                auVar98 = vsubps_avx512f(auVar92,auVar78);
                                auVar99 = vaddps_avx512f(auVar80,auVar87);
                                auVar100 = vaddps_avx512f(auVar79,auVar89);
                                auVar101 = vaddps_avx512f(auVar78,auVar90);
                                auVar102 = vmulps_avx512f(auVar100,auVar93);
                                auVar102 = vfmsub231ps_avx512f(auVar102,auVar82,auVar101);
                                auVar101 = vmulps_avx512f(auVar101,auVar81);
                                auVar101 = vfmsub231ps_avx512f(auVar101,auVar93,auVar99);
                                auVar99 = vmulps_avx512f(auVar99,auVar82);
                                auVar99 = vfmsub231ps_avx512f(auVar99,auVar81,auVar100);
                                auVar99 = vmulps_avx512f(auVar99,auVar86);
                                auVar99 = vfmadd231ps_avx512f(auVar99,auVar85,auVar101);
                                auVar99 = vfmadd231ps_avx512f(auVar99,auVar83,auVar102);
                                auVar100 = vaddps_avx512f(auVar87,auVar84);
                                auVar101 = vaddps_avx512f(auVar89,auVar91);
                                auVar102 = vaddps_avx512f(auVar90,auVar92);
                                auVar103 = vmulps_avx512f(auVar101,auVar95);
                                auVar103 = vfmsub231ps_avx512f(auVar103,in_ZMM16,auVar102);
                                auVar102 = vmulps_avx512f(auVar102,auVar94);
                                auVar102 = vfmsub231ps_avx512f(auVar102,auVar95,auVar100);
                                auVar100 = vmulps_avx512f(auVar100,in_ZMM16);
                                auVar100 = vfmsub231ps_avx512f(auVar100,auVar94,auVar101);
                                auVar100 = vmulps_avx512f(auVar100,auVar86);
                                auVar100 = vfmadd231ps_avx512f(auVar100,auVar85,auVar102);
                                auVar100 = vfmadd231ps_avx512f(auVar100,auVar83,auVar103);
                                auVar80 = vaddps_avx512f(auVar84,auVar80);
                                auVar79 = vaddps_avx512f(auVar91,auVar79);
                                auVar78 = vaddps_avx512f(auVar92,auVar78);
                                auVar84 = vmulps_avx512f(auVar79,auVar98);
                                auVar84 = vfmsub231ps_avx512f(auVar84,auVar97,auVar78);
                                auVar78 = vmulps_avx512f(auVar78,auVar96);
                                auVar78 = vfmsub231ps_avx512f(auVar78,auVar98,auVar80);
                                auVar80 = vmulps_avx512f(auVar80,auVar97);
                                auVar79 = vfmsub231ps_avx512f(auVar80,auVar96,auVar79);
                                auVar79 = vmulps_avx512f(auVar79,auVar86);
                                auVar78 = vfmadd231ps_avx512f(auVar79,auVar85,auVar78);
                                auVar78 = vfmadd231ps_avx512f(auVar78,auVar83,auVar84);
                                auVar79 = vaddps_avx512f(auVar99,auVar100);
                                auVar79 = vaddps_avx512f(auVar78,auVar79);
                                auVar80 = vandps_avx512dq(auVar79,auVar75);
                                auVar80 = vmulps_avx512f(auVar80,auVar74);
                                auVar84 = vminps_avx512f(auVar99,auVar100);
                                auVar84 = vminps_avx512f(auVar84,auVar78);
                                auVar91 = vxorps_avx512dq(auVar80,auVar134);
                                uVar24 = vcmpps_avx512f(auVar84,auVar91,5);
                                auVar84 = vmaxps_avx512f(auVar99,auVar100);
                                auVar78 = vmaxps_avx512f(auVar84,auVar78);
                                uVar25 = vcmpps_avx512f(auVar78,auVar80,2);
                                uVar52 = ((ushort)uVar24 | (ushort)uVar25) & (ushort)uVar47;
                                if (uVar52 != 0) {
                                  auVar78 = vmulps_avx512f(in_ZMM16,auVar93);
                                  auVar80 = vmulps_avx512f(auVar81,auVar95);
                                  auVar84 = vmulps_avx512f(auVar94,auVar82);
                                  auVar91 = vmulps_avx512f(auVar97,auVar95);
                                  auVar92 = vmulps_avx512f(auVar94,auVar98);
                                  auVar101 = vmulps_avx512f(auVar96,in_ZMM16);
                                  auVar82 = vfmsub213ps_avx512f(auVar82,auVar95,auVar78);
                                  auVar93 = vfmsub213ps_avx512f(auVar93,auVar94,auVar80);
                                  auVar81 = vfmsub213ps_avx512f(auVar81,in_ZMM16,auVar84);
                                  auVar98 = vfmsub213ps_avx512f(auVar98,in_ZMM16,auVar91);
                                  auVar95 = vfmsub213ps_avx512f(auVar96,auVar95,auVar92);
                                  auVar94 = vfmsub213ps_avx512f(auVar97,auVar94,auVar101);
                                  auVar78 = vandps_avx512dq(auVar78,auVar75);
                                  auVar91 = vandps_avx512dq(auVar91,auVar75);
                                  uVar50 = vcmpps_avx512f(auVar78,auVar91,1);
                                  auVar78 = vandps_avx512dq(auVar80,auVar75);
                                  auVar80 = vandps_avx512dq(auVar92,auVar75);
                                  uVar64 = vcmpps_avx512f(auVar78,auVar80,1);
                                  auVar78 = vandps_avx512dq(auVar84,auVar75);
                                  auVar80 = vandps_avx512dq(auVar101,auVar75);
                                  uVar71 = vcmpps_avx512f(auVar78,auVar80,1);
                                  bVar69 = (bool)((byte)uVar50 & 1);
                                  auVar108._0_4_ =
                                       (uint)bVar69 * auVar82._0_4_ | (uint)!bVar69 * auVar98._0_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 1) & 1);
                                  auVar108._4_4_ =
                                       (uint)bVar69 * auVar82._4_4_ | (uint)!bVar69 * auVar98._4_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 2) & 1);
                                  auVar108._8_4_ =
                                       (uint)bVar69 * auVar82._8_4_ | (uint)!bVar69 * auVar98._8_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 3) & 1);
                                  auVar108._12_4_ =
                                       (uint)bVar69 * auVar82._12_4_ |
                                       (uint)!bVar69 * auVar98._12_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 4) & 1);
                                  auVar108._16_4_ =
                                       (uint)bVar69 * auVar82._16_4_ |
                                       (uint)!bVar69 * auVar98._16_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 5) & 1);
                                  auVar108._20_4_ =
                                       (uint)bVar69 * auVar82._20_4_ |
                                       (uint)!bVar69 * auVar98._20_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 6) & 1);
                                  auVar108._24_4_ =
                                       (uint)bVar69 * auVar82._24_4_ |
                                       (uint)!bVar69 * auVar98._24_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 7) & 1);
                                  auVar108._28_4_ =
                                       (uint)bVar69 * auVar82._28_4_ |
                                       (uint)!bVar69 * auVar98._28_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 8) & 1);
                                  auVar108._32_4_ =
                                       (uint)bVar69 * auVar82._32_4_ |
                                       (uint)!bVar69 * auVar98._32_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 9) & 1);
                                  auVar108._36_4_ =
                                       (uint)bVar69 * auVar82._36_4_ |
                                       (uint)!bVar69 * auVar98._36_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 10) & 1);
                                  auVar108._40_4_ =
                                       (uint)bVar69 * auVar82._40_4_ |
                                       (uint)!bVar69 * auVar98._40_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 0xb) & 1);
                                  auVar108._44_4_ =
                                       (uint)bVar69 * auVar82._44_4_ |
                                       (uint)!bVar69 * auVar98._44_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 0xc) & 1);
                                  auVar108._48_4_ =
                                       (uint)bVar69 * auVar82._48_4_ |
                                       (uint)!bVar69 * auVar98._48_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 0xd) & 1);
                                  auVar108._52_4_ =
                                       (uint)bVar69 * auVar82._52_4_ |
                                       (uint)!bVar69 * auVar98._52_4_;
                                  bVar69 = (bool)((byte)(uVar50 >> 0xe) & 1);
                                  auVar108._56_4_ =
                                       (uint)bVar69 * auVar82._56_4_ |
                                       (uint)!bVar69 * auVar98._56_4_;
                                  bVar69 = SUB81(uVar50 >> 0xf,0);
                                  auVar108._60_4_ =
                                       (uint)bVar69 * auVar82._60_4_ |
                                       (uint)!bVar69 * auVar98._60_4_;
                                  bVar69 = (bool)((byte)uVar64 & 1);
                                  auVar109._0_4_ =
                                       (uint)bVar69 * auVar93._0_4_ | (uint)!bVar69 * auVar95._0_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
                                  auVar109._4_4_ =
                                       (uint)bVar69 * auVar93._4_4_ | (uint)!bVar69 * auVar95._4_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
                                  auVar109._8_4_ =
                                       (uint)bVar69 * auVar93._8_4_ | (uint)!bVar69 * auVar95._8_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
                                  auVar109._12_4_ =
                                       (uint)bVar69 * auVar93._12_4_ |
                                       (uint)!bVar69 * auVar95._12_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
                                  auVar109._16_4_ =
                                       (uint)bVar69 * auVar93._16_4_ |
                                       (uint)!bVar69 * auVar95._16_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
                                  auVar109._20_4_ =
                                       (uint)bVar69 * auVar93._20_4_ |
                                       (uint)!bVar69 * auVar95._20_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
                                  auVar109._24_4_ =
                                       (uint)bVar69 * auVar93._24_4_ |
                                       (uint)!bVar69 * auVar95._24_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 7) & 1);
                                  auVar109._28_4_ =
                                       (uint)bVar69 * auVar93._28_4_ |
                                       (uint)!bVar69 * auVar95._28_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 8) & 1);
                                  auVar109._32_4_ =
                                       (uint)bVar69 * auVar93._32_4_ |
                                       (uint)!bVar69 * auVar95._32_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 9) & 1);
                                  auVar109._36_4_ =
                                       (uint)bVar69 * auVar93._36_4_ |
                                       (uint)!bVar69 * auVar95._36_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 10) & 1);
                                  auVar109._40_4_ =
                                       (uint)bVar69 * auVar93._40_4_ |
                                       (uint)!bVar69 * auVar95._40_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 0xb) & 1);
                                  auVar109._44_4_ =
                                       (uint)bVar69 * auVar93._44_4_ |
                                       (uint)!bVar69 * auVar95._44_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 0xc) & 1);
                                  auVar109._48_4_ =
                                       (uint)bVar69 * auVar93._48_4_ |
                                       (uint)!bVar69 * auVar95._48_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 0xd) & 1);
                                  auVar109._52_4_ =
                                       (uint)bVar69 * auVar93._52_4_ |
                                       (uint)!bVar69 * auVar95._52_4_;
                                  bVar69 = (bool)((byte)(uVar64 >> 0xe) & 1);
                                  auVar109._56_4_ =
                                       (uint)bVar69 * auVar93._56_4_ |
                                       (uint)!bVar69 * auVar95._56_4_;
                                  bVar69 = SUB81(uVar64 >> 0xf,0);
                                  auVar109._60_4_ =
                                       (uint)bVar69 * auVar93._60_4_ |
                                       (uint)!bVar69 * auVar95._60_4_;
                                  bVar69 = (bool)((byte)uVar71 & 1);
                                  auVar110._0_4_ =
                                       (uint)bVar69 * auVar81._0_4_ | (uint)!bVar69 * auVar94._0_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
                                  auVar110._4_4_ =
                                       (uint)bVar69 * auVar81._4_4_ | (uint)!bVar69 * auVar94._4_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
                                  auVar110._8_4_ =
                                       (uint)bVar69 * auVar81._8_4_ | (uint)!bVar69 * auVar94._8_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
                                  auVar110._12_4_ =
                                       (uint)bVar69 * auVar81._12_4_ |
                                       (uint)!bVar69 * auVar94._12_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
                                  auVar110._16_4_ =
                                       (uint)bVar69 * auVar81._16_4_ |
                                       (uint)!bVar69 * auVar94._16_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
                                  auVar110._20_4_ =
                                       (uint)bVar69 * auVar81._20_4_ |
                                       (uint)!bVar69 * auVar94._20_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
                                  auVar110._24_4_ =
                                       (uint)bVar69 * auVar81._24_4_ |
                                       (uint)!bVar69 * auVar94._24_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 7) & 1);
                                  auVar110._28_4_ =
                                       (uint)bVar69 * auVar81._28_4_ |
                                       (uint)!bVar69 * auVar94._28_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 8) & 1);
                                  auVar110._32_4_ =
                                       (uint)bVar69 * auVar81._32_4_ |
                                       (uint)!bVar69 * auVar94._32_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 9) & 1);
                                  auVar110._36_4_ =
                                       (uint)bVar69 * auVar81._36_4_ |
                                       (uint)!bVar69 * auVar94._36_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 10) & 1);
                                  auVar110._40_4_ =
                                       (uint)bVar69 * auVar81._40_4_ |
                                       (uint)!bVar69 * auVar94._40_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 0xb) & 1);
                                  auVar110._44_4_ =
                                       (uint)bVar69 * auVar81._44_4_ |
                                       (uint)!bVar69 * auVar94._44_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 0xc) & 1);
                                  auVar110._48_4_ =
                                       (uint)bVar69 * auVar81._48_4_ |
                                       (uint)!bVar69 * auVar94._48_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 0xd) & 1);
                                  auVar110._52_4_ =
                                       (uint)bVar69 * auVar81._52_4_ |
                                       (uint)!bVar69 * auVar94._52_4_;
                                  bVar69 = (bool)((byte)(uVar71 >> 0xe) & 1);
                                  auVar110._56_4_ =
                                       (uint)bVar69 * auVar81._56_4_ |
                                       (uint)!bVar69 * auVar94._56_4_;
                                  bVar69 = SUB81(uVar71 >> 0xf,0);
                                  auVar110._60_4_ =
                                       (uint)bVar69 * auVar81._60_4_ |
                                       (uint)!bVar69 * auVar94._60_4_;
                                  auVar78 = vmulps_avx512f(auVar86,auVar110);
                                  auVar78 = vfmadd213ps_avx512f(auVar85,auVar109,auVar78);
                                  auVar78 = vfmadd213ps_avx512f(auVar83,auVar108,auVar78);
                                  auVar78 = vaddps_avx512f(auVar78,auVar78);
                                  auVar80 = vmulps_avx512f(auVar90,auVar110);
                                  auVar80 = vfmadd213ps_avx512f(auVar89,auVar109,auVar80);
                                  auVar80 = vfmadd213ps_avx512f(auVar87,auVar108,auVar80);
                                  auVar81 = vrcp14ps_avx512f(auVar78);
                                  auVar80 = vaddps_avx512f(auVar80,auVar80);
                                  auVar40._8_4_ = 0x3f800000;
                                  auVar40._0_8_ = &DAT_3f8000003f800000;
                                  auVar40._12_4_ = 0x3f800000;
                                  auVar40._16_4_ = 0x3f800000;
                                  auVar40._20_4_ = 0x3f800000;
                                  auVar40._24_4_ = 0x3f800000;
                                  auVar40._28_4_ = 0x3f800000;
                                  auVar40._32_4_ = 0x3f800000;
                                  auVar40._36_4_ = 0x3f800000;
                                  auVar40._40_4_ = 0x3f800000;
                                  auVar40._44_4_ = 0x3f800000;
                                  auVar40._48_4_ = 0x3f800000;
                                  auVar40._52_4_ = 0x3f800000;
                                  auVar40._56_4_ = 0x3f800000;
                                  auVar40._60_4_ = 0x3f800000;
                                  auVar82 = vfnmadd213ps_avx512f(auVar81,auVar78,auVar40);
                                  auVar81 = vfmadd132ps_avx512f(auVar82,auVar81,auVar81);
                                  auVar80 = vmulps_avx512f(auVar80,auVar81);
                                  uVar24 = vcmpps_avx512f(auVar80,*(undefined1 (*) [64])
                                                                   (ray + 0x200),2);
                                  uVar25 = vcmpps_avx512f(auVar80,*(undefined1 (*) [64])(ray + 0xc0)
                                                          ,0xd);
                                  uVar26 = vcmpps_avx512f(auVar78,auVar77,4);
                                  uVar52 = uVar52 & (ushort)uVar24 & (ushort)uVar25 & (ushort)uVar26
                                  ;
                                  if (uVar52 != 0) {
                                    local_4c00 = auVar99;
                                    local_4c40 = auVar100;
                                    local_4c80 = auVar79;
                                    local_4cc0 = auVar80;
                                    local_4d00 = auVar108;
                                    local_4d40 = auVar109;
                                    local_4d80 = auVar110;
                                  }
                                }
                                pGVar2 = (context->scene->geometries).items
                                         [*(uint *)(local_52f0.super_Precalculations.grid + 0x18)].
                                         ptr;
                                auVar78 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
                                uVar24 = vptestmd_avx512f(auVar78,*(undefined1 (*) [64])
                                                                   (ray + 0x240));
                                uVar52 = (ushort)uVar24 & uVar52;
                                uVar49 = (uint)uVar52;
                                if (uVar52 != 0) {
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar74 = vpbroadcastd_avx512f();
                                    auVar78 = vandps_avx512dq(local_4c80,auVar75);
                                    auVar134._8_4_ = 0x219392ef;
                                    auVar134._0_8_ = 0x219392ef219392ef;
                                    auVar134._12_4_ = 0x219392ef;
                                    auVar134._16_4_ = 0x219392ef;
                                    auVar134._20_4_ = 0x219392ef;
                                    auVar134._24_4_ = 0x219392ef;
                                    auVar134._28_4_ = 0x219392ef;
                                    auVar134._32_4_ = 0x219392ef;
                                    auVar134._36_4_ = 0x219392ef;
                                    auVar134._40_4_ = 0x219392ef;
                                    auVar134._44_4_ = 0x219392ef;
                                    auVar134._48_4_ = 0x219392ef;
                                    auVar134._52_4_ = 0x219392ef;
                                    auVar134._56_4_ = 0x219392ef;
                                    auVar134._60_4_ = 0x219392ef;
                                    uVar50 = vcmpps_avx512f(auVar78,auVar134,5);
                                    auVar134 = vrcp14ps_avx512f(local_4c80);
                                    auVar78 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                    auVar79 = vfnmadd213ps_avx512f(auVar134,local_4c80,auVar78);
                                    auVar134 = vfmadd132ps_avx512f(auVar79,auVar134,auVar134);
                                    auVar115._4_4_ =
                                         (uint)((byte)(uVar50 >> 1) & 1) * auVar134._4_4_;
                                    auVar115._0_4_ = (uint)((byte)uVar50 & 1) * auVar134._0_4_;
                                    auVar115._8_4_ =
                                         (uint)((byte)(uVar50 >> 2) & 1) * auVar134._8_4_;
                                    auVar115._12_4_ =
                                         (uint)((byte)(uVar50 >> 3) & 1) * auVar134._12_4_;
                                    auVar115._16_4_ =
                                         (uint)((byte)(uVar50 >> 4) & 1) * auVar134._16_4_;
                                    auVar115._20_4_ =
                                         (uint)((byte)(uVar50 >> 5) & 1) * auVar134._20_4_;
                                    auVar115._24_4_ =
                                         (uint)((byte)(uVar50 >> 6) & 1) * auVar134._24_4_;
                                    auVar115._28_4_ =
                                         (uint)((byte)(uVar50 >> 7) & 1) * auVar134._28_4_;
                                    auVar115._32_4_ =
                                         (uint)((byte)(uVar50 >> 8) & 1) * auVar134._32_4_;
                                    auVar115._36_4_ =
                                         (uint)((byte)(uVar50 >> 9) & 1) * auVar134._36_4_;
                                    auVar115._40_4_ =
                                         (uint)((byte)(uVar50 >> 10) & 1) * auVar134._40_4_;
                                    auVar115._44_4_ =
                                         (uint)((byte)(uVar50 >> 0xb) & 1) * auVar134._44_4_;
                                    auVar115._48_4_ =
                                         (uint)((byte)(uVar50 >> 0xc) & 1) * auVar134._48_4_;
                                    auVar115._52_4_ =
                                         (uint)((byte)(uVar50 >> 0xd) & 1) * auVar134._52_4_;
                                    auVar115._56_4_ =
                                         (uint)((byte)(uVar50 >> 0xe) & 1) * auVar134._56_4_;
                                    auVar115._60_4_ = (uint)(byte)(uVar50 >> 0xf) * auVar134._60_4_;
                                    auVar134 = vmulps_avx512f(auVar115,local_4c00);
                                    auVar134 = vminps_avx512f(auVar134,auVar78);
                                    auVar79 = vmulps_avx512f(auVar115,local_4c40);
                                    auVar79 = vminps_avx512f(auVar79,auVar78);
                                    auVar80 = vpbroadcastd_avx512f
                                                        (ZEXT416(*(uint *)(local_5318 + lVar59)));
                                    auVar81 = vpbroadcastd_avx512f
                                                        (ZEXT416(*(uint *)(local_5320 +
                                                                          lVar59 + 0x2c)));
                                    auVar82 = vpbroadcastd_avx512f
                                                        (ZEXT416(*(uint *)(local_5320 +
                                                                          lVar59 + 0x30)));
                                    auVar83 = vpsrld_avx512f(auVar81,0x10);
                                    auVar84 = vmovdqu16_avx512bw(auVar77);
                                    auVar116._2_2_ = auVar84._2_2_;
                                    auVar116._0_2_ = auVar81._0_2_;
                                    auVar116._4_2_ = auVar81._4_2_;
                                    auVar116._6_2_ = auVar84._6_2_;
                                    auVar116._8_2_ = auVar81._8_2_;
                                    auVar116._10_2_ = auVar84._10_2_;
                                    auVar116._12_2_ = auVar81._12_2_;
                                    auVar116._14_2_ = auVar84._14_2_;
                                    auVar116._16_2_ = auVar81._16_2_;
                                    auVar116._18_2_ = auVar84._18_2_;
                                    auVar116._20_2_ = auVar81._20_2_;
                                    auVar116._22_2_ = auVar84._22_2_;
                                    auVar116._24_2_ = auVar81._24_2_;
                                    auVar116._26_2_ = auVar84._26_2_;
                                    auVar116._28_2_ = auVar81._28_2_;
                                    auVar116._30_2_ = auVar84._30_2_;
                                    auVar116._32_2_ = auVar81._32_2_;
                                    auVar116._34_2_ = auVar84._34_2_;
                                    auVar116._36_2_ = auVar81._36_2_;
                                    auVar116._38_2_ = auVar84._38_2_;
                                    auVar116._40_2_ = auVar81._40_2_;
                                    auVar116._42_2_ = auVar84._42_2_;
                                    auVar116._44_2_ = auVar81._44_2_;
                                    auVar116._46_2_ = auVar84._46_2_;
                                    auVar116._48_2_ = auVar81._48_2_;
                                    auVar116._50_2_ = auVar84._50_2_;
                                    auVar116._52_2_ = auVar81._52_2_;
                                    auVar116._54_2_ = auVar84._54_2_;
                                    auVar116._56_2_ = auVar81._56_2_;
                                    auVar116._58_2_ = auVar84._58_2_;
                                    auVar116._62_2_ = auVar84._62_2_;
                                    auVar116._60_2_ = auVar81._60_2_;
                                    auVar81 = vcvtdq2ps_avx512f(auVar116);
                                    auVar84 = vbroadcastss_avx512f(ZEXT416(0x39000000));
                                    auVar81 = vmulps_avx512f(auVar81,auVar84);
                                    auVar83 = vcvtdq2ps_avx512f(auVar83);
                                    auVar83 = vmulps_avx512f(auVar83,auVar84);
                                    auVar85 = vpsrld_avx512f(auVar80,0x10);
                                    auVar86 = vmovdqu16_avx512bw(auVar77);
                                    auVar117._2_2_ = auVar86._2_2_;
                                    auVar117._0_2_ = auVar80._0_2_;
                                    auVar117._4_2_ = auVar80._4_2_;
                                    auVar117._6_2_ = auVar86._6_2_;
                                    auVar117._8_2_ = auVar80._8_2_;
                                    auVar117._10_2_ = auVar86._10_2_;
                                    auVar117._12_2_ = auVar80._12_2_;
                                    auVar117._14_2_ = auVar86._14_2_;
                                    auVar117._16_2_ = auVar80._16_2_;
                                    auVar117._18_2_ = auVar86._18_2_;
                                    auVar117._20_2_ = auVar80._20_2_;
                                    auVar117._22_2_ = auVar86._22_2_;
                                    auVar117._24_2_ = auVar80._24_2_;
                                    auVar117._26_2_ = auVar86._26_2_;
                                    auVar117._28_2_ = auVar80._28_2_;
                                    auVar117._30_2_ = auVar86._30_2_;
                                    auVar117._32_2_ = auVar80._32_2_;
                                    auVar117._34_2_ = auVar86._34_2_;
                                    auVar117._36_2_ = auVar80._36_2_;
                                    auVar117._38_2_ = auVar86._38_2_;
                                    auVar117._40_2_ = auVar80._40_2_;
                                    auVar117._42_2_ = auVar86._42_2_;
                                    auVar117._44_2_ = auVar80._44_2_;
                                    auVar117._46_2_ = auVar86._46_2_;
                                    auVar117._48_2_ = auVar80._48_2_;
                                    auVar117._50_2_ = auVar86._50_2_;
                                    auVar117._52_2_ = auVar80._52_2_;
                                    auVar117._54_2_ = auVar86._54_2_;
                                    auVar117._56_2_ = auVar80._56_2_;
                                    auVar117._58_2_ = auVar86._58_2_;
                                    auVar117._62_2_ = auVar86._62_2_;
                                    auVar117._60_2_ = auVar80._60_2_;
                                    auVar80 = vcvtdq2ps_avx512f(auVar117);
                                    auVar80 = vmulps_avx512f(auVar80,auVar84);
                                    auVar85 = vcvtdq2ps_avx512f(auVar85);
                                    auVar85 = vmulps_avx512f(auVar85,auVar84);
                                    auVar78 = vsubps_avx512f(auVar78,auVar134);
                                    auVar78 = vsubps_avx512f(auVar78,auVar79);
                                    auVar81 = vmulps_avx512f(auVar78,auVar81);
                                    auVar78 = vmulps_avx512f(auVar78,auVar83);
                                    auVar83 = vpsrld_avx512f(auVar82,0x10);
                                    auVar86 = vmovdqu16_avx512bw(auVar77);
                                    auVar118._2_2_ = auVar86._2_2_;
                                    auVar118._0_2_ = auVar82._0_2_;
                                    auVar118._4_2_ = auVar82._4_2_;
                                    auVar118._6_2_ = auVar86._6_2_;
                                    auVar118._8_2_ = auVar82._8_2_;
                                    auVar118._10_2_ = auVar86._10_2_;
                                    auVar118._12_2_ = auVar82._12_2_;
                                    auVar118._14_2_ = auVar86._14_2_;
                                    auVar118._16_2_ = auVar82._16_2_;
                                    auVar118._18_2_ = auVar86._18_2_;
                                    auVar118._20_2_ = auVar82._20_2_;
                                    auVar118._22_2_ = auVar86._22_2_;
                                    auVar118._24_2_ = auVar82._24_2_;
                                    auVar118._26_2_ = auVar86._26_2_;
                                    auVar118._28_2_ = auVar82._28_2_;
                                    auVar118._30_2_ = auVar86._30_2_;
                                    auVar118._32_2_ = auVar82._32_2_;
                                    auVar118._34_2_ = auVar86._34_2_;
                                    auVar118._36_2_ = auVar82._36_2_;
                                    auVar118._38_2_ = auVar86._38_2_;
                                    auVar118._40_2_ = auVar82._40_2_;
                                    auVar118._42_2_ = auVar86._42_2_;
                                    auVar118._44_2_ = auVar82._44_2_;
                                    auVar118._46_2_ = auVar86._46_2_;
                                    auVar118._48_2_ = auVar82._48_2_;
                                    auVar118._50_2_ = auVar86._50_2_;
                                    auVar118._52_2_ = auVar82._52_2_;
                                    auVar118._54_2_ = auVar86._54_2_;
                                    auVar118._56_2_ = auVar82._56_2_;
                                    auVar118._58_2_ = auVar86._58_2_;
                                    auVar118._62_2_ = auVar86._62_2_;
                                    auVar118._60_2_ = auVar82._60_2_;
                                    auVar82 = vcvtdq2ps_avx512f(auVar118);
                                    auVar82 = vmulps_avx512f(auVar82,auVar84);
                                    auVar83 = vcvtdq2ps_avx512f(auVar83);
                                    auVar83 = vmulps_avx512f(auVar83,auVar84);
                                    auVar81 = vfmadd231ps_avx512f(auVar81,auVar79,auVar82);
                                    auVar78 = vfmadd231ps_avx512f(auVar78,auVar79,auVar83);
                                    local_4f40 = vfmadd231ps_avx512f(auVar81,auVar134,auVar80);
                                    local_4f00 = vfmadd231ps_avx512f(auVar78,auVar134,auVar85);
                                    auVar134 = vpbroadcastd_avx512f();
                                    pRVar3 = context->user;
                                    local_5000 = local_4d00._0_8_;
                                    uStack_4ff8 = local_4d00._8_8_;
                                    uStack_4ff0 = local_4d00._16_8_;
                                    uStack_4fe8 = local_4d00._24_8_;
                                    uStack_4fe0 = local_4d00._32_8_;
                                    uStack_4fd8 = local_4d00._40_8_;
                                    uStack_4fd0 = local_4d00._48_8_;
                                    uStack_4fc8 = local_4d00._56_8_;
                                    local_4fc0 = local_4d40._0_8_;
                                    uStack_4fb8 = local_4d40._8_8_;
                                    uStack_4fb0 = local_4d40._16_8_;
                                    uStack_4fa8 = local_4d40._24_8_;
                                    uStack_4fa0 = local_4d40._32_8_;
                                    uStack_4f98 = local_4d40._40_8_;
                                    uStack_4f90 = local_4d40._48_8_;
                                    uStack_4f88 = local_4d40._56_8_;
                                    local_4f80 = local_4d80._0_8_;
                                    uStack_4f78 = local_4d80._8_8_;
                                    uStack_4f70 = local_4d80._16_8_;
                                    uStack_4f68 = local_4d80._24_8_;
                                    uStack_4f60 = local_4d80._32_8_;
                                    uStack_4f58 = local_4d80._40_8_;
                                    uStack_4f50 = local_4d80._48_8_;
                                    uStack_4f48 = local_4d80._56_8_;
                                    local_4ec0 = vmovdqa64_avx512f(auVar134);
                                    local_4e80 = vmovdqa64_avx512f(auVar74);
                                    auVar21 = vpcmpeqd_avx2(auVar74._0_32_,auVar74._0_32_);
                                    local_52e0[3] = auVar21;
                                    local_52e0[2] = auVar21;
                                    local_52e0[1] = auVar21;
                                    *local_52e0 = auVar21;
                                    local_4e40 = vbroadcastss_avx512f(ZEXT416(pRVar3->instID[0]));
                                    local_4e00 = vbroadcastss_avx512f
                                                           (ZEXT416(pRVar3->instPrimID[0]));
                                    local_5240 = *(undefined1 (*) [64])(ray + 0x200);
                                    auVar74 = vblendmps_avx512f(local_5240,local_4cc0);
                                    bVar69 = (bool)((byte)uVar52 & 1);
                                    bVar5 = (bool)((byte)(uVar52 >> 1) & 1);
                                    bVar6 = (bool)((byte)(uVar52 >> 2) & 1);
                                    bVar7 = (bool)((byte)(uVar52 >> 3) & 1);
                                    bVar8 = (bool)((byte)(uVar52 >> 4) & 1);
                                    bVar9 = (bool)((byte)(uVar52 >> 5) & 1);
                                    bVar10 = (bool)((byte)(uVar52 >> 6) & 1);
                                    bVar11 = (bool)((byte)(uVar52 >> 7) & 1);
                                    bVar12 = (byte)(uVar52 >> 8);
                                    bVar13 = (bool)(bVar12 >> 1 & 1);
                                    bVar14 = (bool)(bVar12 >> 2 & 1);
                                    bVar15 = (bool)(bVar12 >> 3 & 1);
                                    bVar16 = (bool)(bVar12 >> 4 & 1);
                                    bVar17 = (bool)(bVar12 >> 5 & 1);
                                    bVar18 = (bool)(bVar12 >> 6 & 1);
                                    *(uint *)(ray + 0x200) =
                                         (uint)bVar69 * auVar74._0_4_ |
                                         (uint)!bVar69 * local_4e00._0_4_;
                                    *(uint *)(ray + 0x204) =
                                         (uint)bVar5 * auVar74._4_4_ |
                                         (uint)!bVar5 * local_4e00._4_4_;
                                    *(uint *)(ray + 0x208) =
                                         (uint)bVar6 * auVar74._8_4_ |
                                         (uint)!bVar6 * local_4e00._8_4_;
                                    *(uint *)(ray + 0x20c) =
                                         (uint)bVar7 * auVar74._12_4_ |
                                         (uint)!bVar7 * local_4e00._12_4_;
                                    *(uint *)(ray + 0x210) =
                                         (uint)bVar8 * auVar74._16_4_ |
                                         (uint)!bVar8 * local_4e00._16_4_;
                                    *(uint *)(ray + 0x214) =
                                         (uint)bVar9 * auVar74._20_4_ |
                                         (uint)!bVar9 * local_4e00._20_4_;
                                    *(uint *)(ray + 0x218) =
                                         (uint)bVar10 * auVar74._24_4_ |
                                         (uint)!bVar10 * local_4e00._24_4_;
                                    *(uint *)(ray + 0x21c) =
                                         (uint)bVar11 * auVar74._28_4_ |
                                         (uint)!bVar11 * local_4e00._28_4_;
                                    *(uint *)(ray + 0x220) =
                                         (uint)(bVar12 & 1) * auVar74._32_4_ |
                                         (uint)!(bool)(bVar12 & 1) * local_4e00._32_4_;
                                    *(uint *)(ray + 0x224) =
                                         (uint)bVar13 * auVar74._36_4_ |
                                         (uint)!bVar13 * local_4e00._36_4_;
                                    *(uint *)(ray + 0x228) =
                                         (uint)bVar14 * auVar74._40_4_ |
                                         (uint)!bVar14 * local_4e00._40_4_;
                                    *(uint *)(ray + 0x22c) =
                                         (uint)bVar15 * auVar74._44_4_ |
                                         (uint)!bVar15 * local_4e00._44_4_;
                                    *(uint *)(ray + 0x230) =
                                         (uint)bVar16 * auVar74._48_4_ |
                                         (uint)!bVar16 * local_4e00._48_4_;
                                    *(uint *)(ray + 0x234) =
                                         (uint)bVar17 * auVar74._52_4_ |
                                         (uint)!bVar17 * local_4e00._52_4_;
                                    *(uint *)(ray + 0x238) =
                                         (uint)bVar18 * auVar74._56_4_ |
                                         (uint)!bVar18 * local_4e00._56_4_;
                                    *(uint *)(ray + 0x23c) =
                                         (uint)(bVar12 >> 7) * auVar74._60_4_ |
                                         (uint)!(bool)(bVar12 >> 7) * local_4e00._60_4_;
                                    auVar74 = vpmovm2d_avx512dq((ulong)uVar52);
                                    local_5200 = vmovdqa64_avx512f(auVar74);
                                    local_5290.valid = (int *)local_5200;
                                    local_5290.geometryUserPtr = pGVar2->userPtr;
                                    local_5290.context = context->user;
                                    local_5290.hit = (RTCHitN *)&local_5000;
                                    local_5290.N = 0x10;
                                    local_5290.ray = (RTCRayN *)ray;
                                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      (*pGVar2->occlusionFilterN)(&local_5290);
                                      auVar73 = vxorps_avx512vl(auVar73,auVar73);
                                      auVar77 = ZEXT1664(auVar73);
                                      auVar76 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                      auVar75 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                    }
                                    auVar73 = auVar77._0_16_;
                                    auVar74 = vmovdqa64_avx512f(local_5200);
                                    uVar50 = vptestmd_avx512f(auVar74,auVar74);
                                    if ((short)uVar50 != 0) {
                                      p_Var4 = context->args->filter;
                                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                                        (*p_Var4)(&local_5290);
                                        auVar73 = vxorps_avx512vl(auVar73,auVar73);
                                        auVar77 = ZEXT1664(auVar73);
                                        auVar76 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                        auVar75 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                      }
                                      auVar74 = vmovdqa64_avx512f(local_5200);
                                      uVar50 = vptestmd_avx512f(auVar74,auVar74);
                                      auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                      bVar69 = (bool)((byte)uVar50 & 1);
                                      bVar5 = (bool)((byte)(uVar50 >> 1) & 1);
                                      bVar6 = (bool)((byte)(uVar50 >> 2) & 1);
                                      bVar7 = (bool)((byte)(uVar50 >> 3) & 1);
                                      bVar8 = (bool)((byte)(uVar50 >> 4) & 1);
                                      bVar9 = (bool)((byte)(uVar50 >> 5) & 1);
                                      bVar10 = (bool)((byte)(uVar50 >> 6) & 1);
                                      bVar11 = (bool)((byte)(uVar50 >> 7) & 1);
                                      bVar13 = (bool)((byte)(uVar50 >> 8) & 1);
                                      bVar14 = (bool)((byte)(uVar50 >> 9) & 1);
                                      bVar15 = (bool)((byte)(uVar50 >> 10) & 1);
                                      bVar16 = (bool)((byte)(uVar50 >> 0xb) & 1);
                                      bVar17 = (bool)((byte)(uVar50 >> 0xc) & 1);
                                      bVar18 = (bool)((byte)(uVar50 >> 0xd) & 1);
                                      bVar19 = (bool)((byte)(uVar50 >> 0xe) & 1);
                                      bVar20 = SUB81(uVar50 >> 0xf,0);
                                      *(uint *)(local_5290.ray + 0x200) =
                                           (uint)bVar69 * auVar74._0_4_ |
                                           (uint)!bVar69 * *(int *)(local_5290.ray + 0x200);
                                      *(uint *)(local_5290.ray + 0x204) =
                                           (uint)bVar5 * auVar74._4_4_ |
                                           (uint)!bVar5 * *(int *)(local_5290.ray + 0x204);
                                      *(uint *)(local_5290.ray + 0x208) =
                                           (uint)bVar6 * auVar74._8_4_ |
                                           (uint)!bVar6 * *(int *)(local_5290.ray + 0x208);
                                      *(uint *)(local_5290.ray + 0x20c) =
                                           (uint)bVar7 * auVar74._12_4_ |
                                           (uint)!bVar7 * *(int *)(local_5290.ray + 0x20c);
                                      *(uint *)(local_5290.ray + 0x210) =
                                           (uint)bVar8 * auVar74._16_4_ |
                                           (uint)!bVar8 * *(int *)(local_5290.ray + 0x210);
                                      *(uint *)(local_5290.ray + 0x214) =
                                           (uint)bVar9 * auVar74._20_4_ |
                                           (uint)!bVar9 * *(int *)(local_5290.ray + 0x214);
                                      *(uint *)(local_5290.ray + 0x218) =
                                           (uint)bVar10 * auVar74._24_4_ |
                                           (uint)!bVar10 * *(int *)(local_5290.ray + 0x218);
                                      *(uint *)(local_5290.ray + 0x21c) =
                                           (uint)bVar11 * auVar74._28_4_ |
                                           (uint)!bVar11 * *(int *)(local_5290.ray + 0x21c);
                                      *(uint *)(local_5290.ray + 0x220) =
                                           (uint)bVar13 * auVar74._32_4_ |
                                           (uint)!bVar13 * *(int *)(local_5290.ray + 0x220);
                                      *(uint *)(local_5290.ray + 0x224) =
                                           (uint)bVar14 * auVar74._36_4_ |
                                           (uint)!bVar14 * *(int *)(local_5290.ray + 0x224);
                                      *(uint *)(local_5290.ray + 0x228) =
                                           (uint)bVar15 * auVar74._40_4_ |
                                           (uint)!bVar15 * *(int *)(local_5290.ray + 0x228);
                                      *(uint *)(local_5290.ray + 0x22c) =
                                           (uint)bVar16 * auVar74._44_4_ |
                                           (uint)!bVar16 * *(int *)(local_5290.ray + 0x22c);
                                      *(uint *)(local_5290.ray + 0x230) =
                                           (uint)bVar17 * auVar74._48_4_ |
                                           (uint)!bVar17 * *(int *)(local_5290.ray + 0x230);
                                      *(uint *)(local_5290.ray + 0x234) =
                                           (uint)bVar18 * auVar74._52_4_ |
                                           (uint)!bVar18 * *(int *)(local_5290.ray + 0x234);
                                      *(uint *)(local_5290.ray + 0x238) =
                                           (uint)bVar19 * auVar74._56_4_ |
                                           (uint)!bVar19 * *(int *)(local_5290.ray + 0x238);
                                      *(uint *)(local_5290.ray + 0x23c) =
                                           (uint)bVar20 * auVar74._60_4_ |
                                           (uint)!bVar20 * *(int *)(local_5290.ray + 0x23c);
                                    }
                                    uVar49 = (uint)uVar50;
                                    bVar69 = (bool)((byte)uVar50 & 1);
                                    bVar5 = (bool)((byte)(uVar50 >> 1) & 1);
                                    bVar6 = (bool)((byte)(uVar50 >> 2) & 1);
                                    bVar7 = (bool)((byte)(uVar50 >> 3) & 1);
                                    bVar8 = (bool)((byte)(uVar50 >> 4) & 1);
                                    bVar9 = (bool)((byte)(uVar50 >> 5) & 1);
                                    bVar10 = (bool)((byte)(uVar50 >> 6) & 1);
                                    bVar11 = (bool)((byte)(uVar50 >> 7) & 1);
                                    bVar13 = (bool)((byte)(uVar50 >> 8) & 1);
                                    bVar14 = (bool)((byte)(uVar50 >> 9) & 1);
                                    bVar15 = (bool)((byte)(uVar50 >> 10) & 1);
                                    bVar16 = (bool)((byte)(uVar50 >> 0xb) & 1);
                                    bVar17 = (bool)((byte)(uVar50 >> 0xc) & 1);
                                    bVar18 = (bool)((byte)(uVar50 >> 0xd) & 1);
                                    bVar19 = (bool)((byte)(uVar50 >> 0xe) & 1);
                                    bVar20 = SUB81(uVar50 >> 0xf,0);
                                    *(uint *)pRVar1 =
                                         (uint)bVar69 * *(int *)pRVar1 |
                                         (uint)!bVar69 * local_5240._0_4_;
                                    *(uint *)(ray + 0x204) =
                                         (uint)bVar5 * *(int *)(ray + 0x204) |
                                         (uint)!bVar5 * local_5240._4_4_;
                                    *(uint *)(ray + 0x208) =
                                         (uint)bVar6 * *(int *)(ray + 0x208) |
                                         (uint)!bVar6 * local_5240._8_4_;
                                    *(uint *)(ray + 0x20c) =
                                         (uint)bVar7 * *(int *)(ray + 0x20c) |
                                         (uint)!bVar7 * local_5240._12_4_;
                                    *(uint *)(ray + 0x210) =
                                         (uint)bVar8 * *(int *)(ray + 0x210) |
                                         (uint)!bVar8 * local_5240._16_4_;
                                    *(uint *)(ray + 0x214) =
                                         (uint)bVar9 * *(int *)(ray + 0x214) |
                                         (uint)!bVar9 * local_5240._20_4_;
                                    *(uint *)(ray + 0x218) =
                                         (uint)bVar10 * *(int *)(ray + 0x218) |
                                         (uint)!bVar10 * local_5240._24_4_;
                                    *(uint *)(ray + 0x21c) =
                                         (uint)bVar11 * *(int *)(ray + 0x21c) |
                                         (uint)!bVar11 * local_5240._28_4_;
                                    *(uint *)(ray + 0x220) =
                                         (uint)bVar13 * *(int *)(ray + 0x220) |
                                         (uint)!bVar13 * local_5240._32_4_;
                                    *(uint *)(ray + 0x224) =
                                         (uint)bVar14 * *(int *)(ray + 0x224) |
                                         (uint)!bVar14 * local_5240._36_4_;
                                    *(uint *)(ray + 0x228) =
                                         (uint)bVar15 * *(int *)(ray + 0x228) |
                                         (uint)!bVar15 * local_5240._40_4_;
                                    *(uint *)(ray + 0x22c) =
                                         (uint)bVar16 * *(int *)(ray + 0x22c) |
                                         (uint)!bVar16 * local_5240._44_4_;
                                    *(uint *)(ray + 0x230) =
                                         (uint)bVar17 * *(int *)(ray + 0x230) |
                                         (uint)!bVar17 * local_5240._48_4_;
                                    *(uint *)(ray + 0x234) =
                                         (uint)bVar18 * *(int *)(ray + 0x234) |
                                         (uint)!bVar18 * local_5240._52_4_;
                                    *(uint *)(ray + 0x238) =
                                         (uint)bVar19 * *(int *)(ray + 0x238) |
                                         (uint)!bVar19 * local_5240._56_4_;
                                    *(uint *)(ray + 0x23c) =
                                         (uint)bVar20 * *(int *)(ray + 0x23c) |
                                         (uint)!bVar20 * local_5240._60_4_;
                                    auVar74 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                    auVar134 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                  }
                                  uVar47 = ~uVar49 & uVar47;
                                }
                                bVar69 = (short)uVar47 != 0;
                              }
                              lVar59 = lVar59 + 4;
                            } while (bVar69);
                            if (iVar72 == 2) break;
                            local_5320 = local_5320 + local_5260;
                            local_52a0 = local_52a0 + local_5260;
                            local_52a8 = local_52a8 + local_5260;
                            local_52b0 = local_52b0 + local_5260;
                            local_52c0 = local_52c0 + local_5260;
                            local_52d0 = local_52d0 + local_5260;
                            local_52b8 = local_52b8 + local_5260;
                            local_5318 = local_5318 + local_5260;
                            pGVar61 = pGVar61 + local_5260;
                            local_5308 = local_5308 + local_5260;
                            local_5368 = local_5368 + local_5260;
                            local_5298 = local_5298 + local_5260;
                            local_52c8 = local_52c8 + local_5260;
                            pGVar58 = local_5258 + local_5260;
                            bVar69 = local_52d8 == 0;
                            local_52d8 = local_52d8 + 1;
                          } while (bVar69);
                          local_5354 = local_5354 & (uVar47 | uVar48);
                          uVar52 = (ushort)uVar53 & (ushort)uVar48;
                          uVar53 = CONCAT22((short)(uVar53 >> 0x10),uVar52);
                        } while (uVar52 != 0);
                        uVar53 = ~local_5354;
                      }
                      uVar67 = 0;
                    }
                    else {
                      local_52f0.super_Precalculations.grid =
                           *(GridSOA **)(root.ptr & 0xfffffffffffffff0);
                      uVar67 = *(ulong *)local_52f0.super_Precalculations.grid;
                      uVar53 = 0;
                    }
                    local_5370 = uVar53 | local_5370;
                    if ((short)local_5370 == -1) goto LAB_0095524a;
                    auVar78 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar69 = (bool)((byte)local_5370 & 1);
                    bVar5 = (bool)((byte)(local_5370 >> 1) & 1);
                    bVar6 = (bool)((byte)(local_5370 >> 2) & 1);
                    bVar7 = (bool)((byte)(local_5370 >> 3) & 1);
                    bVar8 = (bool)((byte)(local_5370 >> 4) & 1);
                    bVar9 = (bool)((byte)(local_5370 >> 5) & 1);
                    bVar10 = (bool)((byte)(local_5370 >> 6) & 1);
                    bVar11 = (bool)((byte)(local_5370 >> 7) & 1);
                    bVar13 = (bool)((byte)(local_5370 >> 8) & 1);
                    bVar14 = (bool)((byte)(local_5370 >> 9) & 1);
                    bVar15 = (bool)((byte)(local_5370 >> 10) & 1);
                    bVar16 = (bool)((byte)(local_5370 >> 0xb) & 1);
                    bVar17 = (bool)((byte)(local_5370 >> 0xc) & 1);
                    bVar18 = (bool)((byte)(local_5370 >> 0xd) & 1);
                    bVar19 = (bool)((byte)(local_5370 >> 0xe) & 1);
                    bVar20 = (bool)((byte)(local_5370 >> 0xf) & 1);
                    local_44c0 = (uint)bVar69 * auVar78._0_4_ | !bVar69 * local_44c0;
                    uStack_44bc = (uint)bVar5 * auVar78._4_4_ | !bVar5 * uStack_44bc;
                    uStack_44b8 = (uint)bVar6 * auVar78._8_4_ | !bVar6 * uStack_44b8;
                    uStack_44b4 = (uint)bVar7 * auVar78._12_4_ | !bVar7 * uStack_44b4;
                    uStack_44b0 = (uint)bVar8 * auVar78._16_4_ | !bVar8 * uStack_44b0;
                    uStack_44ac = (uint)bVar9 * auVar78._20_4_ | !bVar9 * uStack_44ac;
                    uStack_44a8 = (uint)bVar10 * auVar78._24_4_ | !bVar10 * uStack_44a8;
                    uStack_44a4 = (uint)bVar11 * auVar78._28_4_ | !bVar11 * uStack_44a4;
                    uStack_44a0 = (uint)bVar13 * auVar78._32_4_ | !bVar13 * uStack_44a0;
                    uStack_449c = (uint)bVar14 * auVar78._36_4_ | !bVar14 * uStack_449c;
                    uStack_4498 = (uint)bVar15 * auVar78._40_4_ | !bVar15 * uStack_4498;
                    uStack_4494 = (uint)bVar16 * auVar78._44_4_ | !bVar16 * uStack_4494;
                    uStack_4490 = (uint)bVar17 * auVar78._48_4_ | !bVar17 * uStack_4490;
                    uStack_448c = (uint)bVar18 * auVar78._52_4_ | !bVar18 * uStack_448c;
                    uStack_4488 = (uint)bVar19 * auVar78._56_4_ | !bVar19 * uStack_4488;
                    uStack_4484 = (uint)bVar20 * auVar78._60_4_ | !bVar20 * uStack_4484;
                    iVar72 = 0;
                    if (uVar67 != 0) {
                      *puVar56 = uVar67;
                      puVar56 = puVar56 + 1;
                      auVar78 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      *pauVar68 = auVar78;
                      pauVar68 = pauVar68 + 1;
                    }
                    break;
                  }
                  goto LAB_00955252;
                }
                auVar43._4_4_ = uStack_44bc;
                auVar43._0_4_ = local_44c0;
                auVar43._8_4_ = uStack_44b8;
                auVar43._12_4_ = uStack_44b4;
                auVar43._16_4_ = uStack_44b0;
                auVar43._20_4_ = uStack_44ac;
                auVar43._24_4_ = uStack_44a8;
                auVar43._28_4_ = uStack_44a4;
                auVar43._32_4_ = uStack_44a0;
                auVar43._36_4_ = uStack_449c;
                auVar43._40_4_ = uStack_4498;
                auVar43._44_4_ = uStack_4494;
                auVar43._48_4_ = uStack_4490;
                auVar43._52_4_ = uStack_448c;
                auVar43._56_4_ = uStack_4488;
                auVar43._60_4_ = uStack_4484;
                uVar50 = root.ptr & 0xfffffffffffffff0;
                uVar67 = 0;
                uVar54 = 8;
                auVar78 = auVar76;
                do {
                  uVar64 = *(ulong *)(uVar50 + uVar67 * 8);
                  root.ptr = uVar54;
                  auVar88 = auVar78;
                  if (uVar64 != 8) {
                    auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar50 + 0x80 + uVar67 * 4)));
                    auVar79 = *(undefined1 (*) [64])(ray + 0x1c0);
                    uVar65 = *(undefined4 *)(uVar50 + 0x20 + uVar67 * 4);
                    auVar27._4_4_ = uVar65;
                    auVar27._0_4_ = uVar65;
                    auVar27._8_4_ = uVar65;
                    auVar27._12_4_ = uVar65;
                    auVar27._16_4_ = uVar65;
                    auVar27._20_4_ = uVar65;
                    auVar27._24_4_ = uVar65;
                    auVar27._28_4_ = uVar65;
                    auVar27._32_4_ = uVar65;
                    auVar27._36_4_ = uVar65;
                    auVar27._40_4_ = uVar65;
                    auVar27._44_4_ = uVar65;
                    auVar27._48_4_ = uVar65;
                    auVar27._52_4_ = uVar65;
                    auVar27._56_4_ = uVar65;
                    auVar27._60_4_ = uVar65;
                    auVar80 = vfmadd213ps_avx512f(auVar80,auVar79,auVar27);
                    auVar81 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar50 + 0xa0 + uVar67 * 4)));
                    uVar65 = *(undefined4 *)(uVar50 + 0x40 + uVar67 * 4);
                    auVar28._4_4_ = uVar65;
                    auVar28._0_4_ = uVar65;
                    auVar28._8_4_ = uVar65;
                    auVar28._12_4_ = uVar65;
                    auVar28._16_4_ = uVar65;
                    auVar28._20_4_ = uVar65;
                    auVar28._24_4_ = uVar65;
                    auVar28._28_4_ = uVar65;
                    auVar28._32_4_ = uVar65;
                    auVar28._36_4_ = uVar65;
                    auVar28._40_4_ = uVar65;
                    auVar28._44_4_ = uVar65;
                    auVar28._48_4_ = uVar65;
                    auVar28._52_4_ = uVar65;
                    auVar28._56_4_ = uVar65;
                    auVar28._60_4_ = uVar65;
                    auVar81 = vfmadd213ps_avx512f(auVar81,auVar79,auVar28);
                    auVar82 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar50 + 0xc0 + uVar67 * 4)));
                    uVar65 = *(undefined4 *)(uVar50 + 0x60 + uVar67 * 4);
                    auVar29._4_4_ = uVar65;
                    auVar29._0_4_ = uVar65;
                    auVar29._8_4_ = uVar65;
                    auVar29._12_4_ = uVar65;
                    auVar29._16_4_ = uVar65;
                    auVar29._20_4_ = uVar65;
                    auVar29._24_4_ = uVar65;
                    auVar29._28_4_ = uVar65;
                    auVar29._32_4_ = uVar65;
                    auVar29._36_4_ = uVar65;
                    auVar29._40_4_ = uVar65;
                    auVar29._44_4_ = uVar65;
                    auVar29._48_4_ = uVar65;
                    auVar29._52_4_ = uVar65;
                    auVar29._56_4_ = uVar65;
                    auVar29._60_4_ = uVar65;
                    auVar82 = vfmadd213ps_avx512f(auVar82,auVar79,auVar29);
                    auVar83 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar50 + 0x90 + uVar67 * 4)));
                    uVar65 = *(undefined4 *)(uVar50 + 0x30 + uVar67 * 4);
                    auVar30._4_4_ = uVar65;
                    auVar30._0_4_ = uVar65;
                    auVar30._8_4_ = uVar65;
                    auVar30._12_4_ = uVar65;
                    auVar30._16_4_ = uVar65;
                    auVar30._20_4_ = uVar65;
                    auVar30._24_4_ = uVar65;
                    auVar30._28_4_ = uVar65;
                    auVar30._32_4_ = uVar65;
                    auVar30._36_4_ = uVar65;
                    auVar30._40_4_ = uVar65;
                    auVar30._44_4_ = uVar65;
                    auVar30._48_4_ = uVar65;
                    auVar30._52_4_ = uVar65;
                    auVar30._56_4_ = uVar65;
                    auVar30._60_4_ = uVar65;
                    auVar83 = vfmadd213ps_avx512f(auVar83,auVar79,auVar30);
                    auVar84 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar50 + 0xb0 + uVar67 * 4)));
                    uVar65 = *(undefined4 *)(uVar50 + 0x50 + uVar67 * 4);
                    auVar31._4_4_ = uVar65;
                    auVar31._0_4_ = uVar65;
                    auVar31._8_4_ = uVar65;
                    auVar31._12_4_ = uVar65;
                    auVar31._16_4_ = uVar65;
                    auVar31._20_4_ = uVar65;
                    auVar31._24_4_ = uVar65;
                    auVar31._28_4_ = uVar65;
                    auVar31._32_4_ = uVar65;
                    auVar31._36_4_ = uVar65;
                    auVar31._40_4_ = uVar65;
                    auVar31._44_4_ = uVar65;
                    auVar31._48_4_ = uVar65;
                    auVar31._52_4_ = uVar65;
                    auVar31._56_4_ = uVar65;
                    auVar31._60_4_ = uVar65;
                    auVar84 = vfmadd213ps_avx512f(auVar84,auVar79,auVar31);
                    auVar85 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar50 + 0xd0 + uVar67 * 4)));
                    uVar65 = *(undefined4 *)(uVar50 + 0x70 + uVar67 * 4);
                    auVar32._4_4_ = uVar65;
                    auVar32._0_4_ = uVar65;
                    auVar32._8_4_ = uVar65;
                    auVar32._12_4_ = uVar65;
                    auVar32._16_4_ = uVar65;
                    auVar32._20_4_ = uVar65;
                    auVar32._24_4_ = uVar65;
                    auVar32._28_4_ = uVar65;
                    auVar32._32_4_ = uVar65;
                    auVar32._36_4_ = uVar65;
                    auVar32._40_4_ = uVar65;
                    auVar32._44_4_ = uVar65;
                    auVar32._48_4_ = uVar65;
                    auVar32._52_4_ = uVar65;
                    auVar32._56_4_ = uVar65;
                    auVar32._60_4_ = uVar65;
                    auVar85 = vfmadd213ps_avx512f(auVar85,auVar79,auVar32);
                    auVar80 = vfmsub213ps_avx512f(auVar80,local_4740,local_4680);
                    auVar81 = vfmsub213ps_avx512f(auVar81,local_4700,local_4640);
                    auVar82 = vfmsub213ps_avx512f(auVar82,local_46c0,local_4600);
                    auVar83 = vfmsub213ps_avx512f(auVar83,local_4740,local_4680);
                    auVar84 = vfmsub213ps_avx512f(auVar84,local_4700,local_4640);
                    auVar85 = vfmsub213ps_avx512f(auVar85,local_46c0,local_4600);
                    auVar86 = vpminsd_avx512f(auVar80,auVar83);
                    auVar87 = vpminsd_avx512f(auVar81,auVar84);
                    auVar86 = vpmaxsd_avx512f(auVar86,auVar87);
                    auVar87 = vpminsd_avx512f(auVar82,auVar85);
                    auVar86 = vpmaxsd_avx512f(auVar86,auVar87);
                    auVar80 = vpmaxsd_avx512f(auVar80,auVar83);
                    auVar81 = vpmaxsd_avx512f(auVar81,auVar84);
                    auVar80 = vpminsd_avx512f(auVar80,auVar81);
                    auVar81 = vpmaxsd_avx512f(auVar82,auVar85);
                    auVar80 = vpminsd_avx512f(auVar80,auVar81);
                    auVar42._4_4_ = uStack_44fc;
                    auVar42._0_4_ = local_4500;
                    auVar42._8_4_ = uStack_44f8;
                    auVar42._12_4_ = uStack_44f4;
                    auVar42._16_4_ = uStack_44f0;
                    auVar42._20_4_ = uStack_44ec;
                    auVar42._24_4_ = uStack_44e8;
                    auVar42._28_4_ = uStack_44e4;
                    auVar42._32_4_ = uStack_44e0;
                    auVar42._36_4_ = uStack_44dc;
                    auVar42._40_4_ = uStack_44d8;
                    auVar42._44_4_ = uStack_44d4;
                    auVar42._48_4_ = uStack_44d0;
                    auVar42._52_4_ = uStack_44cc;
                    auVar42._56_4_ = uStack_44c8;
                    auVar42._60_4_ = uStack_44c4;
                    auVar81 = vpmaxsd_avx512f(auVar86,auVar42);
                    auVar44._4_4_ = uStack_44bc;
                    auVar44._0_4_ = local_44c0;
                    auVar44._8_4_ = uStack_44b8;
                    auVar44._12_4_ = uStack_44b4;
                    auVar44._16_4_ = uStack_44b0;
                    auVar44._20_4_ = uStack_44ac;
                    auVar44._24_4_ = uStack_44a8;
                    auVar44._28_4_ = uStack_44a4;
                    auVar44._32_4_ = uStack_44a0;
                    auVar44._36_4_ = uStack_449c;
                    auVar44._40_4_ = uStack_4498;
                    auVar44._44_4_ = uStack_4494;
                    auVar44._48_4_ = uStack_4490;
                    auVar44._52_4_ = uStack_448c;
                    auVar44._56_4_ = uStack_4488;
                    auVar44._60_4_ = uStack_4484;
                    auVar80 = vpminsd_avx512f(auVar80,auVar44);
                    uVar71 = vcmpps_avx512f(auVar81,auVar80,2);
                    if ((uVar53 & 7) == 6) {
                      uVar65 = *(undefined4 *)(uVar50 + 0xe0 + uVar67 * 4);
                      auVar33._4_4_ = uVar65;
                      auVar33._0_4_ = uVar65;
                      auVar33._8_4_ = uVar65;
                      auVar33._12_4_ = uVar65;
                      auVar33._16_4_ = uVar65;
                      auVar33._20_4_ = uVar65;
                      auVar33._24_4_ = uVar65;
                      auVar33._28_4_ = uVar65;
                      auVar33._32_4_ = uVar65;
                      auVar33._36_4_ = uVar65;
                      auVar33._40_4_ = uVar65;
                      auVar33._44_4_ = uVar65;
                      auVar33._48_4_ = uVar65;
                      auVar33._52_4_ = uVar65;
                      auVar33._56_4_ = uVar65;
                      auVar33._60_4_ = uVar65;
                      uVar22 = vcmpps_avx512f(auVar79,auVar33,0xd);
                      uVar65 = *(undefined4 *)(uVar50 + 0xf0 + uVar67 * 4);
                      auVar34._4_4_ = uVar65;
                      auVar34._0_4_ = uVar65;
                      auVar34._8_4_ = uVar65;
                      auVar34._12_4_ = uVar65;
                      auVar34._16_4_ = uVar65;
                      auVar34._20_4_ = uVar65;
                      auVar34._24_4_ = uVar65;
                      auVar34._28_4_ = uVar65;
                      auVar34._32_4_ = uVar65;
                      auVar34._36_4_ = uVar65;
                      auVar34._40_4_ = uVar65;
                      auVar34._44_4_ = uVar65;
                      auVar34._48_4_ = uVar65;
                      auVar34._52_4_ = uVar65;
                      auVar34._56_4_ = uVar65;
                      auVar34._60_4_ = uVar65;
                      uVar23 = vcmpps_avx512f(auVar79,auVar34,1);
                      uVar71 = uVar71 & uVar22 & uVar23;
                    }
                    uVar22 = vcmpps_avx512f(auVar43,local_51c0,6);
                    uVar71 = uVar71 & uVar22;
                    if ((short)uVar71 != 0) {
                      auVar80 = vblendmps_avx512f(auVar76,auVar86);
                      bVar69 = (bool)((byte)uVar71 & 1);
                      auVar88._0_4_ = (uint)bVar69 * auVar80._0_4_ | (uint)!bVar69 * auVar79._0_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
                      auVar88._4_4_ = (uint)bVar69 * auVar80._4_4_ | (uint)!bVar69 * auVar79._4_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
                      auVar88._8_4_ = (uint)bVar69 * auVar80._8_4_ | (uint)!bVar69 * auVar79._8_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
                      auVar88._12_4_ =
                           (uint)bVar69 * auVar80._12_4_ | (uint)!bVar69 * auVar79._12_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
                      auVar88._16_4_ =
                           (uint)bVar69 * auVar80._16_4_ | (uint)!bVar69 * auVar79._16_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
                      auVar88._20_4_ =
                           (uint)bVar69 * auVar80._20_4_ | (uint)!bVar69 * auVar79._20_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
                      auVar88._24_4_ =
                           (uint)bVar69 * auVar80._24_4_ | (uint)!bVar69 * auVar79._24_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 7) & 1);
                      auVar88._28_4_ =
                           (uint)bVar69 * auVar80._28_4_ | (uint)!bVar69 * auVar79._28_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 8) & 1);
                      auVar88._32_4_ =
                           (uint)bVar69 * auVar80._32_4_ | (uint)!bVar69 * auVar79._32_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 9) & 1);
                      auVar88._36_4_ =
                           (uint)bVar69 * auVar80._36_4_ | (uint)!bVar69 * auVar79._36_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 10) & 1);
                      auVar88._40_4_ =
                           (uint)bVar69 * auVar80._40_4_ | (uint)!bVar69 * auVar79._40_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 0xb) & 1);
                      auVar88._44_4_ =
                           (uint)bVar69 * auVar80._44_4_ | (uint)!bVar69 * auVar79._44_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 0xc) & 1);
                      auVar88._48_4_ =
                           (uint)bVar69 * auVar80._48_4_ | (uint)!bVar69 * auVar79._48_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 0xd) & 1);
                      auVar88._52_4_ =
                           (uint)bVar69 * auVar80._52_4_ | (uint)!bVar69 * auVar79._52_4_;
                      bVar69 = (bool)((byte)(uVar71 >> 0xe) & 1);
                      auVar88._56_4_ =
                           (uint)bVar69 * auVar80._56_4_ | (uint)!bVar69 * auVar79._56_4_;
                      bVar69 = SUB81(uVar71 >> 0xf,0);
                      auVar88._60_4_ =
                           (uint)bVar69 * auVar80._60_4_ | (uint)!bVar69 * auVar79._60_4_;
                      root.ptr = uVar64;
                      if (uVar54 != 8) {
                        *puVar56 = uVar54;
                        puVar56 = puVar56 + 1;
                        *pauVar68 = auVar78;
                        pauVar68 = pauVar68 + 1;
                      }
                    }
                  }
                } while ((uVar64 != 8) &&
                        (bVar69 = uVar67 < 3, uVar67 = uVar67 + 1, uVar54 = root.ptr,
                        auVar78 = auVar88, bVar69));
                iVar72 = 0;
                if (root.ptr == 8) {
LAB_00953ea7:
                  bVar69 = false;
                  iVar72 = 4;
                }
                else {
                  auVar45._4_4_ = uStack_44bc;
                  auVar45._0_4_ = local_44c0;
                  auVar45._8_4_ = uStack_44b8;
                  auVar45._12_4_ = uStack_44b4;
                  auVar45._16_4_ = uStack_44b0;
                  auVar45._20_4_ = uStack_44ac;
                  auVar45._24_4_ = uStack_44a8;
                  auVar45._28_4_ = uStack_44a4;
                  auVar45._32_4_ = uStack_44a0;
                  auVar45._36_4_ = uStack_449c;
                  auVar45._40_4_ = uStack_4498;
                  auVar45._44_4_ = uStack_4494;
                  auVar45._48_4_ = uStack_4490;
                  auVar45._52_4_ = uStack_448c;
                  auVar45._56_4_ = uStack_4488;
                  auVar45._60_4_ = uStack_4484;
                  uVar24 = vcmpps_avx512f(auVar88,auVar45,9);
                  bVar69 = true;
                  if ((uint)POPCOUNT((int)uVar24) <= uVar62) {
                    *puVar56 = root.ptr;
                    puVar56 = puVar56 + 1;
                    *pauVar68 = auVar88;
                    pauVar68 = pauVar68 + 1;
                    goto LAB_00953ea7;
                  }
                }
                local_51c0 = auVar88;
              } while (bVar69);
            }
          }
        }
      } while (iVar72 != 3);
      local_5370 = local_5370 & (uint)uVar70;
      auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar69 = (bool)((byte)local_5370 & 1);
      bVar5 = (bool)((byte)(local_5370 >> 1) & 1);
      bVar6 = (bool)((byte)(local_5370 >> 2) & 1);
      bVar7 = (bool)((byte)(local_5370 >> 3) & 1);
      bVar8 = (bool)((byte)(local_5370 >> 4) & 1);
      bVar9 = (bool)((byte)(local_5370 >> 5) & 1);
      bVar10 = (bool)((byte)(local_5370 >> 6) & 1);
      bVar11 = (bool)((byte)(local_5370 >> 7) & 1);
      bVar13 = (bool)((byte)(local_5370 >> 8) & 1);
      bVar14 = (bool)((byte)(local_5370 >> 9) & 1);
      bVar15 = (bool)((byte)(local_5370 >> 10) & 1);
      bVar16 = (bool)((byte)(local_5370 >> 0xb) & 1);
      bVar17 = (bool)((byte)(local_5370 >> 0xc) & 1);
      bVar18 = (bool)((byte)(local_5370 >> 0xd) & 1);
      bVar19 = (bool)((byte)(local_5370 >> 0xe) & 1);
      bVar20 = (bool)((byte)(local_5370 >> 0xf) & 1);
      *(uint *)pRVar1 = (uint)bVar69 * auVar74._0_4_ | (uint)!bVar69 * *(int *)pRVar1;
      *(uint *)(ray + 0x204) = (uint)bVar5 * auVar74._4_4_ | (uint)!bVar5 * *(int *)(ray + 0x204);
      *(uint *)(ray + 0x208) = (uint)bVar6 * auVar74._8_4_ | (uint)!bVar6 * *(int *)(ray + 0x208);
      *(uint *)(ray + 0x20c) = (uint)bVar7 * auVar74._12_4_ | (uint)!bVar7 * *(int *)(ray + 0x20c);
      *(uint *)(ray + 0x210) = (uint)bVar8 * auVar74._16_4_ | (uint)!bVar8 * *(int *)(ray + 0x210);
      *(uint *)(ray + 0x214) = (uint)bVar9 * auVar74._20_4_ | (uint)!bVar9 * *(int *)(ray + 0x214);
      *(uint *)(ray + 0x218) = (uint)bVar10 * auVar74._24_4_ | (uint)!bVar10 * *(int *)(ray + 0x218)
      ;
      *(uint *)(ray + 0x21c) = (uint)bVar11 * auVar74._28_4_ | (uint)!bVar11 * *(int *)(ray + 0x21c)
      ;
      *(uint *)(ray + 0x220) = (uint)bVar13 * auVar74._32_4_ | (uint)!bVar13 * *(int *)(ray + 0x220)
      ;
      *(uint *)(ray + 0x224) = (uint)bVar14 * auVar74._36_4_ | (uint)!bVar14 * *(int *)(ray + 0x224)
      ;
      *(uint *)(ray + 0x228) = (uint)bVar15 * auVar74._40_4_ | (uint)!bVar15 * *(int *)(ray + 0x228)
      ;
      *(uint *)(ray + 0x22c) = (uint)bVar16 * auVar74._44_4_ | (uint)!bVar16 * *(int *)(ray + 0x22c)
      ;
      *(uint *)(ray + 0x230) = (uint)bVar17 * auVar74._48_4_ | (uint)!bVar17 * *(int *)(ray + 0x230)
      ;
      *(uint *)(ray + 0x234) = (uint)bVar18 * auVar74._52_4_ | (uint)!bVar18 * *(int *)(ray + 0x234)
      ;
      *(uint *)(ray + 0x238) = (uint)bVar19 * auVar74._56_4_ | (uint)!bVar19 * *(int *)(ray + 0x238)
      ;
      *(uint *)(ray + 0x23c) = (uint)bVar20 * auVar74._60_4_ | (uint)!bVar20 * *(int *)(ray + 0x23c)
      ;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }